

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::LRN_x86_avx::forward_inplace(LRN_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [24];
  undefined1 auVar62 [24];
  bool bVar63;
  float *pfVar64;
  undefined1 (*pauVar65) [32];
  undefined8 *in_RDX;
  long in_RSI;
  long *in_RDI;
  double dVar66;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar75;
  float fVar76;
  float fVar77;
  float val;
  int k;
  float ss;
  float *sptr_1;
  int j_1;
  int i_4;
  Mat m;
  float *ptr_2;
  int q_2;
  int j;
  int i_3;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  float alpha_div_size_1;
  int maxk;
  Option opt_b;
  int pad;
  Mat square_blob_bordered;
  int outh;
  int outw;
  __m256 _ssp_1;
  __m256 _p_1;
  __m256 _mb;
  __m256 _ads;
  __m256 _bias;
  int i_1;
  float *ssptr;
  float *ptr_1;
  __m256 _ssp;
  __m256 _sp;
  int i_2;
  float *ssptr_1;
  float *sptr;
  int p;
  int q_1;
  float alpha_div_size;
  Mat square_sum;
  __m256 _outp;
  __m256 _p;
  int i;
  float *outptr;
  float *ptr;
  int q;
  Mat square_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  __m256 pow2n;
  __m256 y_1;
  __m256 z_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  undefined4 in_stack_ffffffffffffdbe0;
  undefined4 in_stack_ffffffffffffdbe4;
  Mat *in_stack_ffffffffffffdbe8;
  Mat *this_00;
  undefined4 in_stack_ffffffffffffdbf0;
  float in_stack_ffffffffffffdbf4;
  undefined4 in_stack_ffffffffffffdbf8;
  int in_stack_ffffffffffffdbfc;
  int in_stack_ffffffffffffdc00;
  int in_stack_ffffffffffffdc04;
  undefined4 in_stack_ffffffffffffdc08;
  float in_stack_ffffffffffffdc0c;
  Mat *in_stack_ffffffffffffdc10;
  undefined8 in_stack_ffffffffffffdc18;
  undefined8 in_stack_ffffffffffffdc20;
  undefined8 in_stack_ffffffffffffdc28;
  undefined7 in_stack_ffffffffffffdc30;
  undefined1 in_stack_ffffffffffffdc37;
  undefined4 in_stack_ffffffffffffdc38;
  undefined4 in_stack_ffffffffffffdc3c;
  int in_stack_ffffffffffffdc48;
  undefined4 in_stack_ffffffffffffdc50;
  undefined4 in_stack_ffffffffffffdc54;
  int local_2058;
  float local_2054;
  int local_2048;
  int local_2044;
  Mat local_2040;
  Mat local_1ff8;
  float *local_1fb0;
  int local_1fa8;
  int local_1fa4;
  int local_1fa0;
  int local_1f9c;
  int local_1f98;
  int local_1f94;
  reference local_1f90;
  vector<int,_std::allocator<int>_> local_1f80;
  float local_1f68;
  int local_1f64;
  Mat local_1f60;
  int local_1f14;
  int local_1ee4;
  int local_1ee0;
  int local_1ec8;
  int local_1ec4;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined1 local_1e80 [32];
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  int local_1e04;
  Mat local_1e00;
  float *local_1db8;
  Mat local_1db0;
  undefined1 (*local_1d68) [32];
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  int local_1d1c;
  Mat local_1d18;
  undefined1 (*local_1cd0) [32];
  Mat local_1cc8;
  float *local_1c80;
  int local_1c74;
  int local_1c70;
  float local_1c6c;
  Mat local_1c68;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  int local_1bcc;
  Mat local_1bc8;
  undefined1 (*local_1b80) [32];
  Mat local_1b78;
  float *local_1b30;
  int local_1b24;
  int local_1b20;
  Mat local_1b10;
  int local_1ac4;
  undefined8 local_1ac0;
  int local_1ab4;
  int local_1ab0;
  int local_1aac;
  undefined8 *local_1aa8;
  int local_1a8c;
  float *local_1a88;
  undefined1 (*local_1a80) [32];
  undefined1 (*local_1a78) [32];
  float *local_1a70;
  float *local_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined1 (*local_1968) [32];
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined1 (*local_1928) [32];
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined1 (*local_18e8) [32];
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  uint local_184c;
  float local_1848;
  uint local_1844;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined1 local_17c0 [32];
  uint local_17a0;
  uint local_179c;
  uint local_1798;
  uint local_1794;
  uint local_1790;
  uint local_178c;
  uint local_1788;
  uint local_1784;
  undefined1 local_1780 [32];
  float local_1760;
  float local_175c;
  float local_1758;
  float local_1754;
  float local_1750;
  float local_174c;
  float local_1748;
  float local_1744;
  undefined1 local_1740 [32];
  uint local_1720;
  uint local_171c;
  uint local_1718;
  uint local_1714;
  uint local_1710;
  uint local_170c;
  uint local_1708;
  uint local_1704;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  float local_16c0;
  float fStack_16bc;
  float fStack_16b8;
  float fStack_16b4;
  float fStack_16b0;
  float fStack_16ac;
  float fStack_16a8;
  float fStack_16a4;
  undefined1 local_16a0 [32];
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined1 local_1640 [8];
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined1 local_1620 [8];
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined1 local_1600 [8];
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined1 local_1120 [8];
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  undefined1 local_10e0 [8];
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [8];
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined1 local_1080 [32];
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined1 local_1020 [8];
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 local_700 [32];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined4 local_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined4 local_374;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined4 local_354;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined4 local_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined4 local_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1aac = *(int *)(in_RSI + 0x2c);
  local_1ab0 = *(int *)(in_RSI + 0x30);
  local_1ab4 = *(int *)(in_RSI + 0x38);
  local_1ac0 = *(undefined8 *)(in_RSI + 0x10);
  local_1ac4 = local_1aac * local_1ab0;
  local_1aa8 = in_RDX;
  ncnn::Mat::Mat(&local_1b10);
  ncnn::Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffdc0c,in_stack_ffffffffffffdc08),
                    in_stack_ffffffffffffdc04,in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbfc,
                    CONCAT44(in_stack_ffffffffffffdbf4,in_stack_ffffffffffffdbf0),
                    (Allocator *)in_stack_ffffffffffffdbe8);
  bVar63 = ncnn::Mat::empty(in_stack_ffffffffffffdbe8);
  if (bVar63) {
    local_1a8c = -100;
    local_1b20 = 1;
    goto LAB_004b8475;
  }
  for (local_1b24 = 0; fVar70 = (float)((ulong)in_stack_ffffffffffffdc18 >> 0x20),
      local_1b24 < local_1ab4; local_1b24 = local_1b24 + 1) {
    ncnn::Mat::channel(in_stack_ffffffffffffdc10,(int)in_stack_ffffffffffffdc0c);
    pfVar64 = ncnn::Mat::operator_cast_to_float_(&local_1b78);
    ncnn::Mat::~Mat((Mat *)0x4b5861);
    local_1b30 = pfVar64;
    ncnn::Mat::channel(in_stack_ffffffffffffdc10,(int)in_stack_ffffffffffffdc0c);
    pauVar65 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1bc8);
    ncnn::Mat::~Mat((Mat *)0x4b58b3);
    local_1b80 = pauVar65;
    for (local_1bcc = 0; local_1bcc + 7 < local_1ac4; local_1bcc = local_1bcc + 8) {
      local_1a68 = local_1b30;
      local_1c00 = *(undefined8 *)local_1b30;
      uStack_1bf8 = *(undefined8 *)(local_1b30 + 2);
      uStack_1bf0 = *(undefined8 *)(local_1b30 + 4);
      uStack_1be8 = *(undefined8 *)(local_1b30 + 6);
      local_19c0._0_4_ = (float)local_1c00;
      local_19c0._4_4_ = (float)((ulong)local_1c00 >> 0x20);
      uStack_19b8._0_4_ = (float)uStack_1bf8;
      uStack_19b8._4_4_ = (float)((ulong)uStack_1bf8 >> 0x20);
      uStack_19b0._0_4_ = (float)uStack_1bf0;
      uStack_19b0._4_4_ = (float)((ulong)uStack_1bf0 >> 0x20);
      uStack_19a8._0_4_ = (float)uStack_1be8;
      uStack_19a8._4_4_ = (undefined4)((ulong)uStack_1be8 >> 0x20);
      local_1c20 = CONCAT44(local_19c0._4_4_ * local_19c0._4_4_,
                            (float)local_19c0 * (float)local_19c0);
      uStack_1c18 = CONCAT44(uStack_19b8._4_4_ * uStack_19b8._4_4_,
                             (float)uStack_19b8 * (float)uStack_19b8);
      uStack_1c10 = CONCAT44(uStack_19b0._4_4_ * uStack_19b0._4_4_,
                             (float)uStack_19b0 * (float)uStack_19b0);
      uStack_1c08 = CONCAT44(uStack_19a8._4_4_,(float)uStack_19a8 * (float)uStack_19a8);
      local_18e8 = local_1b80;
      auVar7._8_8_ = uStack_1c18;
      auVar7._0_8_ = local_1c20;
      auVar7._16_8_ = uStack_1c10;
      auVar7._24_8_ = uStack_1c08;
      *local_1b80 = auVar7;
      local_1b30 = local_1b30 + 8;
      local_1b80 = local_1b80 + 1;
      local_19e0 = local_1c00;
      uStack_19d8 = uStack_1bf8;
      uStack_19d0 = uStack_1bf0;
      uStack_19c8 = uStack_1be8;
      local_19c0 = local_1c00;
      uStack_19b8 = uStack_1bf8;
      uStack_19b0 = uStack_1bf0;
      uStack_19a8 = uStack_1be8;
      local_1920 = local_1c20;
      uStack_1918 = uStack_1c18;
      uStack_1910 = uStack_1c10;
      uStack_1908 = uStack_1c08;
    }
    for (; local_1bcc < local_1ac4; local_1bcc = local_1bcc + 1) {
      *(float *)*local_1b80 = *local_1b30 * *local_1b30;
      local_1b30 = local_1b30 + 1;
      local_1b80 = (undefined1 (*) [32])(*local_1b80 + 4);
    }
  }
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
    ncnn::Mat::Mat(&local_1c68);
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffdc0c,in_stack_ffffffffffffdc08),
                      in_stack_ffffffffffffdc04,in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbfc,
                      CONCAT44(in_stack_ffffffffffffdbf4,in_stack_ffffffffffffdbf0),
                      (Allocator *)in_stack_ffffffffffffdbe8);
    bVar63 = ncnn::Mat::empty(in_stack_ffffffffffffdbe8);
    if (bVar63) {
      local_1a8c = -100;
      local_1b20 = 1;
    }
    else {
      ncnn::Mat::fill((Mat *)CONCAT44(in_stack_ffffffffffffdbfc,in_stack_ffffffffffffdbf8),
                      in_stack_ffffffffffffdbf4);
      local_1c6c = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) /
                   (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      for (local_1c70 = 0; local_1c70 < local_1ab4; local_1c70 = local_1c70 + 1) {
        for (local_1c74 = local_1c70 -
                          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 2;
            local_1c74 <=
            local_1c70 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 2;
            local_1c74 = local_1c74 + 1) {
          if ((-1 < local_1c74) && (local_1c74 < local_1ab4)) {
            ncnn::Mat::channel(in_stack_ffffffffffffdc10,(int)in_stack_ffffffffffffdc0c);
            pfVar64 = ncnn::Mat::operator_cast_to_float_(&local_1cc8);
            ncnn::Mat::~Mat((Mat *)0x4b5cc4);
            local_1c80 = pfVar64;
            ncnn::Mat::channel(in_stack_ffffffffffffdc10,(int)in_stack_ffffffffffffdc0c);
            pauVar65 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1d18);
            ncnn::Mat::~Mat((Mat *)0x4b5d16);
            local_1cd0 = pauVar65;
            for (local_1d1c = 0; local_1d1c + 7 < local_1ac4; local_1d1c = local_1d1c + 8) {
              local_1a70 = local_1c80;
              local_1d40 = *(undefined8 *)local_1c80;
              uStack_1d38 = *(undefined8 *)(local_1c80 + 2);
              uStack_1d30 = *(undefined8 *)(local_1c80 + 4);
              uStack_1d28 = *(undefined8 *)(local_1c80 + 6);
              local_1a78 = local_1cd0;
              uVar10 = *(undefined8 *)*local_1cd0;
              uVar11 = *(undefined8 *)(*local_1cd0 + 8);
              uVar12 = *(undefined8 *)(*local_1cd0 + 0x10);
              uVar13 = *(undefined8 *)(*local_1cd0 + 0x18);
              local_1880._0_4_ = (float)uVar10;
              local_1880._4_4_ = (float)((ulong)uVar10 >> 0x20);
              uStack_1878._0_4_ = (float)uVar11;
              uStack_1878._4_4_ = (float)((ulong)uVar11 >> 0x20);
              uStack_1870._0_4_ = (float)uVar12;
              uStack_1870._4_4_ = (float)((ulong)uVar12 >> 0x20);
              uStack_1868._0_4_ = (float)uVar13;
              uStack_1868._4_4_ = (float)((ulong)uVar13 >> 0x20);
              local_18a0._0_4_ = (float)local_1d40;
              local_18a0._4_4_ = (float)((ulong)local_1d40 >> 0x20);
              uStack_1898._0_4_ = (float)uStack_1d38;
              uStack_1898._4_4_ = (float)((ulong)uStack_1d38 >> 0x20);
              uStack_1890._0_4_ = (float)uStack_1d30;
              uStack_1890._4_4_ = (float)((ulong)uStack_1d30 >> 0x20);
              uStack_1888._0_4_ = (float)uStack_1d28;
              uStack_1888._4_4_ = (float)((ulong)uStack_1d28 >> 0x20);
              local_1d60 = CONCAT44(local_1880._4_4_ + local_18a0._4_4_,
                                    (float)local_1880 + (float)local_18a0);
              uStack_1d58 = CONCAT44(uStack_1878._4_4_ + uStack_1898._4_4_,
                                     (float)uStack_1878 + (float)uStack_1898);
              uStack_1d50 = CONCAT44(uStack_1870._4_4_ + uStack_1890._4_4_,
                                     (float)uStack_1870 + (float)uStack_1890);
              uStack_1d48 = CONCAT44(uStack_1868._4_4_ + uStack_1888._4_4_,
                                     (float)uStack_1868 + (float)uStack_1888);
              local_1928 = local_1cd0;
              auVar8._8_8_ = uStack_1d58;
              auVar8._0_8_ = local_1d60;
              auVar8._16_8_ = uStack_1d50;
              auVar8._24_8_ = uStack_1d48;
              *local_1cd0 = auVar8;
              local_1c80 = local_1c80 + 8;
              local_1cd0 = local_1cd0 + 1;
              local_1960 = local_1d60;
              uStack_1958 = uStack_1d58;
              uStack_1950 = uStack_1d50;
              uStack_1948 = uStack_1d48;
              local_18a0 = local_1d40;
              uStack_1898 = uStack_1d38;
              uStack_1890 = uStack_1d30;
              uStack_1888 = uStack_1d28;
              local_1880 = uVar10;
              uStack_1878 = uVar11;
              uStack_1870 = uVar12;
              uStack_1868 = uVar13;
            }
            for (; local_1d1c < local_1ac4; local_1d1c = local_1d1c + 1) {
              *(float *)*local_1cd0 = *local_1c80 + *(float *)*local_1cd0;
              local_1c80 = local_1c80 + 1;
              local_1cd0 = (undefined1 (*) [32])(*local_1cd0 + 4);
            }
          }
        }
        ncnn::Mat::channel(in_stack_ffffffffffffdc10,(int)in_stack_ffffffffffffdc0c);
        pauVar65 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1db0);
        ncnn::Mat::~Mat((Mat *)0x4b5f8e);
        local_1d68 = pauVar65;
        ncnn::Mat::channel(in_stack_ffffffffffffdc10,(int)in_stack_ffffffffffffdc0c);
        pfVar64 = ncnn::Mat::operator_cast_to_float_(&local_1e00);
        ncnn::Mat::~Mat((Mat *)0x4b5fe0);
        local_1e04 = 0;
        local_1844 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0);
        auVar1 = vinsertps_avx(ZEXT416(local_1844),ZEXT416(local_1844),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_1844),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_1844),0x30);
        auVar2 = vinsertps_avx(ZEXT416(local_1844),ZEXT416(local_1844),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1844),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1844),0x30);
        auVar67._16_16_ = auVar1;
        auVar67._0_16_ = auVar2;
        local_17c0._0_8_ = auVar2._0_8_;
        local_17c0._8_8_ = auVar2._8_8_;
        local_17c0._16_8_ = auVar1._0_8_;
        local_17c0._24_8_ = auVar1._8_8_;
        local_1e40 = local_17c0._0_8_;
        uStack_1e38 = local_17c0._8_8_;
        uStack_1e30 = local_17c0._16_8_;
        uStack_1e28 = local_17c0._24_8_;
        local_1848 = local_1c6c;
        local_1744 = local_1c6c;
        local_1748 = local_1c6c;
        local_174c = local_1c6c;
        local_1750 = local_1c6c;
        local_1754 = local_1c6c;
        local_1758 = local_1c6c;
        local_175c = local_1c6c;
        local_1760 = local_1c6c;
        auVar3 = vinsertps_avx(ZEXT416((uint)local_1c6c),ZEXT416((uint)local_1c6c),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_1c6c),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_1c6c),0x30);
        auVar4 = vinsertps_avx(ZEXT416((uint)local_1c6c),ZEXT416((uint)local_1c6c),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)local_1c6c),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)local_1c6c),0x30);
        auVar68._16_16_ = auVar3;
        auVar68._0_16_ = auVar4;
        local_1780._0_8_ = auVar4._0_8_;
        local_1780._8_8_ = auVar4._8_8_;
        local_1780._16_8_ = auVar3._0_8_;
        local_1780._24_8_ = auVar3._8_8_;
        local_1e60 = local_1780._0_8_;
        uStack_1e58 = local_1780._8_8_;
        uStack_1e50 = local_1780._16_8_;
        uStack_1e48 = local_1780._24_8_;
        local_184c = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) ^ 0x80000000;
        auVar5 = vinsertps_avx(ZEXT416(local_184c),ZEXT416(local_184c),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(local_184c),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(local_184c),0x30);
        auVar6 = vinsertps_avx(ZEXT416(local_184c),ZEXT416(local_184c),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(local_184c),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(local_184c),0x30);
        auVar69._16_16_ = auVar5;
        auVar69._0_16_ = auVar6;
        local_1740._0_8_ = auVar6._0_8_;
        local_1740._8_8_ = auVar6._8_8_;
        local_1740._16_8_ = auVar5._0_8_;
        local_1740._24_8_ = auVar5._8_8_;
        local_1e80._16_8_ = local_1740._16_8_;
        local_1e80._0_16_ = auVar6;
        local_1e80._24_8_ = local_1740._24_8_;
        local_1db8 = pfVar64;
        for (; local_17a0 = local_1844, local_179c = local_1844, local_1798 = local_1844,
            local_1794 = local_1844, local_1790 = local_1844, local_178c = local_1844,
            local_1788 = local_1844, local_1784 = local_1844, local_1720 = local_184c,
            local_171c = local_184c, local_1718 = local_184c, local_1714 = local_184c,
            local_1710 = local_184c, local_170c = local_184c, local_1708 = local_184c,
            local_1704 = local_184c, local_1e04 + 7 < local_1ac4; local_1e04 = local_1e04 + 8) {
          local_1a80 = local_1d68;
          uVar10 = *(undefined8 *)*local_1d68;
          uVar11 = *(undefined8 *)(*local_1d68 + 8);
          uVar12 = *(undefined8 *)(*local_1d68 + 0x10);
          uVar13 = *(undefined8 *)(*local_1d68 + 0x18);
          local_1a88 = local_1db8;
          uVar14 = *(undefined8 *)local_1db8;
          uVar15 = *(undefined8 *)(local_1db8 + 2);
          uVar16 = *(undefined8 *)(local_1db8 + 4);
          uVar17 = *(undefined8 *)(local_1db8 + 6);
          local_1a00._0_4_ = (float)uVar14;
          local_1a00._4_4_ = (float)((ulong)uVar14 >> 0x20);
          uStack_19f8._0_4_ = (float)uVar15;
          uStack_19f8._4_4_ = (float)((ulong)uVar15 >> 0x20);
          uStack_19f0._0_4_ = (float)uVar16;
          uStack_19f0._4_4_ = (float)((ulong)uVar16 >> 0x20);
          uStack_19e8._0_4_ = (float)uVar17;
          uStack_19e8._4_4_ = (float)((ulong)uVar17 >> 0x20);
          local_1a20._0_4_ = auVar4._0_4_;
          local_1a20._4_4_ = auVar4._4_4_;
          uStack_1a18._0_4_ = auVar4._8_4_;
          uStack_1a18._4_4_ = auVar4._12_4_;
          uStack_1a10._0_4_ = auVar3._0_4_;
          uStack_1a10._4_4_ = auVar3._4_4_;
          uStack_1a08._0_4_ = auVar3._8_4_;
          local_18c0 = CONCAT44(local_1a00._4_4_ * local_1a20._4_4_,
                                (float)local_1a00 * (float)local_1a20);
          uStack_18b8 = CONCAT44(uStack_19f8._4_4_ * uStack_1a18._4_4_,
                                 (float)uStack_19f8 * (float)uStack_1a18);
          uStack_18b0 = CONCAT44(uStack_19f0._4_4_ * uStack_1a10._4_4_,
                                 (float)uStack_19f0 * (float)uStack_1a10);
          uStack_18a8 = CONCAT44(uStack_19e8._4_4_,(float)uStack_19e8 * (float)uStack_1a08);
          local_18e0._0_4_ = auVar2._0_4_;
          local_18e0._4_4_ = auVar2._4_4_;
          uStack_18d8._0_4_ = auVar2._8_4_;
          uStack_18d8._4_4_ = auVar2._12_4_;
          uStack_18d0._0_4_ = auVar1._0_4_;
          uStack_18d0._4_4_ = auVar1._4_4_;
          uStack_18c8._0_4_ = auVar1._8_4_;
          uStack_18c8._4_4_ = auVar1._12_4_;
          local_1820 = CONCAT44(local_1a00._4_4_ * local_1a20._4_4_ + local_18e0._4_4_,
                                (float)local_1a00 * (float)local_1a20 + (float)local_18e0);
          uStack_1818 = CONCAT44(uStack_19f8._4_4_ * uStack_1a18._4_4_ + uStack_18d8._4_4_,
                                 (float)uStack_19f8 * (float)uStack_1a18 + (float)uStack_18d8);
          uStack_1810 = CONCAT44(uStack_19f0._4_4_ * uStack_1a10._4_4_ + uStack_18d0._4_4_,
                                 (float)uStack_19f0 * (float)uStack_1a10 + (float)uStack_18d0);
          uStack_1808 = CONCAT44(uStack_19e8._4_4_ + uStack_18c8._4_4_,
                                 (float)uStack_19e8 * (float)uStack_1a08 + (float)uStack_18c8);
          local_1840 = local_1740._0_8_;
          uStack_1838 = local_1740._8_8_;
          uStack_1830 = local_1740._16_8_;
          uStack_1828 = local_1740._24_8_;
          uStack_1018 = uStack_1818;
          local_1020 = (undefined1  [8])local_1820;
          uStack_1010 = uStack_1810;
          uStack_1008 = uStack_1808;
          local_1060 = 0x3f8000003f800000;
          uStack_1058 = 0x3f8000003f800000;
          uStack_1050 = 0x3f8000003f800000;
          uStack_1048 = 0x3f8000003f800000;
          local_940 = ZEXT832(0) << 0x20;
          local_1080 = vcmpps_avx(_local_1020,local_940,2);
          local_8c0 = 0x80000000800000;
          uStack_8b8 = 0x80000000800000;
          uStack_8b0 = 0x80000000800000;
          uStack_8a8 = 0x80000000800000;
          auVar41._16_8_ = uStack_1810;
          auVar41._0_16_ = _local_1020;
          auVar41._24_8_ = uStack_1808;
          auVar40._8_8_ = 0x80000000800000;
          auVar40._0_8_ = 0x80000000800000;
          auVar40._16_8_ = 0x80000000800000;
          auVar40._24_8_ = 0x80000000800000;
          auVar7 = vmaxps_avx(auVar41,auVar40);
          local_1020 = auVar7._0_8_;
          local_280 = local_1020;
          uStack_1018 = auVar7._8_8_;
          uStack_278 = uStack_1018;
          uStack_1010 = auVar7._16_8_;
          uStack_270 = uStack_1010;
          uStack_1008 = auVar7._24_8_;
          uStack_268 = uStack_1008;
          local_2a0 = local_1020;
          uStack_298 = uStack_1018;
          uStack_290 = uStack_1010;
          uStack_288 = uStack_1008;
          local_2a4 = 0x17;
          local_320 = local_1020;
          uStack_318 = uStack_1018;
          uStack_310 = uStack_1010;
          uStack_308 = uStack_1008;
          local_80 = local_1020;
          uStack_78 = uStack_1018;
          local_84 = 0x17;
          local_2c0 = vpsrld_avx(auVar7._0_16_,ZEXT416(0x17));
          local_a0 = uStack_1010;
          uStack_98 = uStack_1008;
          local_a4 = 0x17;
          local_2d0 = vpsrld_avx(auVar7._16_16_,ZEXT416(0x17));
          local_340 = local_2c0._0_8_;
          uStack_338 = local_2c0._8_8_;
          uStack_330 = local_2d0._0_8_;
          uStack_328 = local_2d0._8_8_;
          local_300 = local_2c0._0_8_;
          uStack_2f8 = local_2c0._8_8_;
          uStack_2f0 = local_2d0._0_8_;
          uStack_2e8 = local_2d0._8_8_;
          local_7a0 = local_1020;
          uStack_798 = uStack_1018;
          uStack_790 = uStack_1010;
          uStack_788 = uStack_1008;
          local_7c0 = 0x807fffff807fffff;
          uStack_7b8 = 0x807fffff807fffff;
          uStack_7b0 = 0x807fffff807fffff;
          uStack_7a8 = 0x807fffff807fffff;
          auVar44._8_8_ = 0x807fffff807fffff;
          auVar44._0_8_ = 0x807fffff807fffff;
          auVar44._16_8_ = 0x807fffff807fffff;
          auVar44._24_8_ = 0x807fffff807fffff;
          auVar7 = vandps_avx(auVar7,auVar44);
          local_1020 = auVar7._0_8_;
          local_200 = local_1020;
          uStack_1018 = auVar7._8_8_;
          uStack_1f8 = uStack_1018;
          uStack_1010 = auVar7._16_8_;
          uStack_1f0 = uStack_1010;
          uStack_1008 = auVar7._24_8_;
          uStack_1e8 = uStack_1008;
          local_220 = 0x3f0000003f000000;
          uStack_218 = 0x3f0000003f000000;
          uStack_210 = 0x3f0000003f000000;
          uStack_208 = 0x3f0000003f000000;
          auVar57._8_8_ = 0x3f0000003f000000;
          auVar57._0_8_ = 0x3f0000003f000000;
          auVar57._16_8_ = 0x3f0000003f000000;
          auVar57._24_8_ = 0x3f0000003f000000;
          auVar8 = vorps_avx(auVar7,auVar57);
          local_100 = local_2c0._0_8_;
          uStack_f8 = local_2c0._8_8_;
          uStack_f0 = local_2d0._0_8_;
          uStack_e8 = local_2d0._8_8_;
          local_120 = 0x7f0000007f;
          uStack_118 = 0x7f0000007f;
          uStack_110 = 0x7f0000007f;
          uStack_108 = 0x7f0000007f;
          local_1a0 = local_2c0._0_8_;
          uStack_198 = local_2c0._8_8_;
          uStack_190 = local_2d0._0_8_;
          uStack_188 = local_2d0._8_8_;
          local_1c0 = 0x7f0000007f;
          uStack_1b8 = 0x7f0000007f;
          uStack_1b0 = 0x7f0000007f;
          uStack_1a8 = 0x7f0000007f;
          local_150 = 0x7f0000007f;
          uStack_148 = 0x7f0000007f;
          local_160 = 0x7f0000007f;
          uStack_158 = 0x7f0000007f;
          local_40 = local_2c0._0_8_;
          uStack_38 = local_2c0._8_8_;
          local_50 = 0x7f0000007f;
          uStack_48 = 0x7f0000007f;
          auVar60._8_8_ = 0x7f0000007f;
          auVar60._0_8_ = 0x7f0000007f;
          local_130 = vpsubd_avx(local_2c0,auVar60);
          local_60 = local_2d0._0_8_;
          uStack_58 = local_2d0._8_8_;
          local_70 = 0x7f0000007f;
          uStack_68 = 0x7f0000007f;
          auVar59._8_8_ = 0x7f0000007f;
          auVar59._0_8_ = 0x7f0000007f;
          local_140 = vpsubd_avx(local_2d0,auVar59);
          local_1e0 = local_130._0_8_;
          uStack_1d8 = local_130._8_8_;
          uStack_1d0 = local_140._0_8_;
          uStack_1c8 = local_140._8_8_;
          local_180 = local_130._0_8_;
          uStack_178 = local_130._8_8_;
          uStack_170 = local_140._0_8_;
          uStack_168 = local_140._8_8_;
          local_1040 = local_130._0_8_;
          uStack_1038 = local_130._8_8_;
          uStack_1030 = local_140._0_8_;
          uStack_1028 = local_140._8_8_;
          local_e0 = local_130._0_8_;
          uStack_d8 = local_130._8_8_;
          uStack_d0 = local_140._0_8_;
          uStack_c8 = local_140._8_8_;
          auVar58._16_8_ = local_140._0_8_;
          auVar58._0_16_ = local_130;
          auVar58._24_8_ = local_140._8_8_;
          auVar7 = vcvtdq2ps_avx(auVar58);
          local_10a0 = auVar7._0_8_;
          uVar18 = local_10a0;
          uStack_1098 = auVar7._8_8_;
          uVar19 = uStack_1098;
          uStack_1090 = auVar7._16_8_;
          uVar20 = uStack_1090;
          uStack_1088 = auVar7._24_8_;
          uVar21 = uStack_1088;
          local_980 = 0x3f8000003f800000;
          uStack_978 = 0x3f8000003f800000;
          uStack_970 = 0x3f8000003f800000;
          uStack_968 = 0x3f8000003f800000;
          local_960._0_4_ = auVar7._0_4_;
          local_960._4_4_ = auVar7._4_4_;
          uStack_958._0_4_ = auVar7._8_4_;
          uStack_958._4_4_ = auVar7._12_4_;
          uStack_950._0_4_ = auVar7._16_4_;
          uStack_950._4_4_ = auVar7._20_4_;
          uStack_948._0_4_ = auVar7._24_4_;
          uStack_948._4_4_ = auVar7._28_4_;
          local_10a0._4_4_ = local_960._4_4_ + 1.0;
          local_10a0._0_4_ = (float)local_960 + 1.0;
          uStack_1098._0_4_ = (float)uStack_958 + 1.0;
          uStack_1098._4_4_ = uStack_958._4_4_ + 1.0;
          uStack_1090._0_4_ = (float)uStack_950 + 1.0;
          uStack_1090._4_4_ = uStack_950._4_4_ + 1.0;
          auVar61 = _local_10a0;
          uStack_1088._0_4_ = (float)uStack_948 + 1.0;
          uStack_1088._4_4_ = uStack_948._4_4_ + 1.0;
          auVar9 = _local_10a0;
          local_10c0 = vcmpps_avx(auVar8,_DAT_0095ab20,1);
          local_1020 = auVar8._0_8_;
          local_7e0 = local_1020;
          uStack_1018 = auVar8._8_8_;
          uStack_7d8 = uStack_1018;
          uStack_1010 = auVar8._16_8_;
          uStack_7d0 = uStack_1010;
          uStack_1008 = auVar8._24_8_;
          uStack_7c8 = uStack_1008;
          local_800 = local_10c0._0_8_;
          uStack_7f8 = local_10c0._8_8_;
          uStack_7f0 = local_10c0._16_8_;
          uStack_7e8 = local_10c0._24_8_;
          auVar7 = vandps_avx(auVar8,local_10c0);
          local_6a0 = local_1020;
          uStack_698 = uStack_1018;
          uStack_690 = uStack_1010;
          uStack_688 = uStack_1008;
          local_6c0 = 0x3f8000003f800000;
          uStack_6b8 = 0x3f8000003f800000;
          uStack_6b0 = 0x3f8000003f800000;
          uStack_6a8 = 0x3f8000003f800000;
          auVar49._8_8_ = 0x3f8000003f800000;
          auVar49._0_8_ = 0x3f8000003f800000;
          auVar49._16_8_ = 0x3f8000003f800000;
          auVar49._24_8_ = 0x3f8000003f800000;
          auVar8 = vsubps_avx(auVar8,auVar49);
          local_6e0 = local_10a0;
          uStack_6d8 = uStack_1098;
          uStack_1090 = auVar61._16_8_;
          uStack_6d0 = uStack_1090;
          uStack_1088 = auVar9._24_8_;
          uStack_6c8 = uStack_1088;
          local_820 = 0x3f8000003f800000;
          uStack_818 = 0x3f8000003f800000;
          uStack_810 = 0x3f8000003f800000;
          uStack_808 = 0x3f8000003f800000;
          local_840 = local_10c0._0_8_;
          uStack_838 = local_10c0._8_8_;
          uStack_830 = local_10c0._16_8_;
          uStack_828 = local_10c0._24_8_;
          auVar43._8_8_ = 0x3f8000003f800000;
          auVar43._0_8_ = 0x3f8000003f800000;
          auVar43._16_8_ = 0x3f8000003f800000;
          auVar43._24_8_ = 0x3f8000003f800000;
          local_700 = vandps_avx(auVar43,local_10c0);
          auVar48._16_8_ = uStack_1090;
          auVar48._0_16_ = _local_10a0;
          auVar48._24_8_ = uStack_1088;
          _local_10a0 = vsubps_avx(auVar48,local_700);
          local_1020 = auVar8._0_8_;
          uVar22 = local_1020;
          uStack_1018 = auVar8._8_8_;
          uVar23 = uStack_1018;
          uStack_1010 = auVar8._16_8_;
          uVar24 = uStack_1010;
          uStack_1008 = auVar8._24_8_;
          uVar25 = uStack_1008;
          local_10e0 = auVar7._0_8_;
          uVar26 = local_10e0;
          uStack_10d8 = auVar7._8_8_;
          uVar27 = uStack_10d8;
          uStack_10d0 = auVar7._16_8_;
          uVar28 = uStack_10d0;
          uStack_10c8 = auVar7._24_8_;
          uVar29 = uStack_10c8;
          local_9a0._0_4_ = auVar8._0_4_;
          local_9a0._4_4_ = auVar8._4_4_;
          uStack_998._0_4_ = auVar8._8_4_;
          uStack_998._4_4_ = auVar8._12_4_;
          uStack_990._0_4_ = auVar8._16_4_;
          uStack_990._4_4_ = auVar8._20_4_;
          uStack_988._0_4_ = auVar8._24_4_;
          uStack_988._4_4_ = auVar8._28_4_;
          local_9c0._0_4_ = auVar7._0_4_;
          local_9c0._4_4_ = auVar7._4_4_;
          uStack_9b8._0_4_ = auVar7._8_4_;
          uStack_9b8._4_4_ = auVar7._12_4_;
          uStack_9b0._0_4_ = auVar7._16_4_;
          uStack_9b0._4_4_ = auVar7._20_4_;
          uStack_9a8._0_4_ = auVar7._24_4_;
          uStack_9a8._4_4_ = auVar7._28_4_;
          local_9a0._0_4_ = (float)local_9a0 + (float)local_9c0;
          local_9a0._4_4_ = local_9a0._4_4_ + local_9c0._4_4_;
          uStack_998._0_4_ = (float)uStack_998 + (float)uStack_9b8;
          uStack_998._4_4_ = uStack_998._4_4_ + uStack_9b8._4_4_;
          uStack_990._0_4_ = (float)uStack_990 + (float)uStack_9b0;
          uStack_990._4_4_ = uStack_990._4_4_ + uStack_9b0._4_4_;
          uStack_988._0_4_ = (float)uStack_988 + (float)uStack_9a8;
          fStack_10e4 = uStack_988._4_4_ + uStack_9a8._4_4_;
          local_1020._4_4_ = local_9a0._4_4_;
          local_1020._0_4_ = (float)local_9a0;
          uStack_1018._0_4_ = (float)uStack_998;
          uStack_1018._4_4_ = uStack_998._4_4_;
          uStack_1010._0_4_ = (float)uStack_990;
          uStack_1010._4_4_ = uStack_990._4_4_;
          auVar61 = _local_1020;
          uStack_1008._0_4_ = (float)uStack_988;
          uStack_1008._4_4_ = fStack_10e4;
          auVar7 = _local_1020;
          local_cc0 = local_1020;
          uStack_cb8 = uStack_1018;
          uStack_1010 = auVar61._16_8_;
          uStack_cb0 = uStack_1010;
          uStack_1008 = auVar7._24_8_;
          uStack_ca8 = uStack_1008;
          local_1100 = (float)local_9a0 * (float)local_9a0;
          fStack_10fc = local_9a0._4_4_ * local_9a0._4_4_;
          fStack_10f8 = (float)uStack_998 * (float)uStack_998;
          fStack_10f4 = uStack_998._4_4_ * uStack_998._4_4_;
          fStack_10f0 = (float)uStack_990 * (float)uStack_990;
          fStack_10ec = uStack_990._4_4_ * uStack_990._4_4_;
          fStack_10e8 = (float)uStack_988 * (float)uStack_988;
          local_ce0 = 0x3d9021bb3d9021bb;
          uStack_cd8 = 0x3d9021bb3d9021bb;
          uStack_cd0 = 0x3d9021bb3d9021bb;
          uStack_cc8 = 0x3d9021bb3d9021bb;
          local_d00 = local_1020;
          uStack_cf8 = uStack_1018;
          uStack_cf0 = uStack_1010;
          uStack_ce8 = uStack_1008;
          local_1120._4_4_ = local_9a0._4_4_ * 0.070376836;
          local_1120._0_4_ = (float)local_9a0 * 0.070376836;
          uStack_1118._0_4_ = (float)uStack_998 * 0.070376836;
          uStack_1118._4_4_ = uStack_998._4_4_ * 0.070376836;
          uStack_1110._0_4_ = (float)uStack_990 * 0.070376836;
          uStack_1110._4_4_ = uStack_990._4_4_ * 0.070376836;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = (float)uStack_988 * 0.070376836;
          uStack_1108._4_4_ = 0x3d9021bb;
          auVar7 = _local_1120;
          local_9e0 = local_1120;
          uStack_9d8 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_9d0 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_9c8 = uStack_1108;
          local_a00 = 0xbdebd1b8bdebd1b8;
          uStack_9f8 = 0xbdebd1b8bdebd1b8;
          uStack_9f0 = 0xbdebd1b8bdebd1b8;
          uStack_9e8 = 0xbdebd1b8bdebd1b8;
          local_1120._0_4_ = (float)local_9a0 * 0.070376836 + -0.1151461;
          local_1120._4_4_ = local_9a0._4_4_ * 0.070376836 + -0.1151461;
          fVar70 = (float)uStack_998 * 0.070376836 + -0.1151461;
          fVar71 = uStack_998._4_4_ * 0.070376836 + -0.1151461;
          fVar72 = (float)uStack_990 * 0.070376836 + -0.1151461;
          fVar73 = uStack_990._4_4_ * 0.070376836 + -0.1151461;
          fVar74 = (float)uStack_988 * 0.070376836 + -0.1151461;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0xbd375ffa;
          auVar7 = _local_1120;
          local_d20 = local_1120;
          uStack_d18 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_d10 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_d08 = uStack_1108;
          local_d40 = local_1020;
          uStack_d38 = uStack_1018;
          uStack_d30 = uStack_1010;
          uStack_d28 = uStack_1008;
          local_1120._0_4_ = (float)local_1120._0_4_ * (float)local_9a0;
          local_1120._4_4_ = (float)local_1120._4_4_ * local_9a0._4_4_;
          fVar70 = fVar70 * (float)uStack_998;
          fVar71 = fVar71 * uStack_998._4_4_;
          fVar72 = fVar72 * (float)uStack_990;
          fVar73 = fVar73 * uStack_990._4_4_;
          fVar74 = fVar74 * (float)uStack_988;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0xbd375ffa;
          auVar7 = _local_1120;
          local_a20 = local_1120;
          uStack_a18 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_a10 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_a08 = uStack_1108;
          local_a40 = 0x3def251a3def251a;
          uStack_a38 = 0x3def251a3def251a;
          uStack_a30 = 0x3def251a3def251a;
          uStack_a28 = 0x3def251a3def251a;
          local_1120._0_4_ = (float)local_1120._0_4_ + 0.116769984;
          local_1120._4_4_ = (float)local_1120._4_4_ + 0.116769984;
          fVar70 = fVar70 + 0.116769984;
          fVar71 = fVar71 + 0.116769984;
          fVar72 = fVar72 + 0.116769984;
          fVar73 = fVar73 + 0.116769984;
          fVar74 = fVar74 + 0.116769984;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0x3d93751d;
          auVar7 = _local_1120;
          local_d60 = local_1120;
          uStack_d58 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_d50 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_d48 = uStack_1108;
          local_d80 = local_1020;
          uStack_d78 = uStack_1018;
          uStack_d70 = uStack_1010;
          uStack_d68 = uStack_1008;
          local_1120._0_4_ = (float)local_1120._0_4_ * (float)local_9a0;
          local_1120._4_4_ = (float)local_1120._4_4_ * local_9a0._4_4_;
          fVar70 = fVar70 * (float)uStack_998;
          fVar71 = fVar71 * uStack_998._4_4_;
          fVar72 = fVar72 * (float)uStack_990;
          fVar73 = fVar73 * uStack_990._4_4_;
          fVar74 = fVar74 * (float)uStack_988;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0x3d93751d;
          auVar7 = _local_1120;
          local_a60 = local_1120;
          uStack_a58 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_a50 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_a48 = uStack_1108;
          local_a80 = 0xbdfe5d4fbdfe5d4f;
          uStack_a78 = 0xbdfe5d4fbdfe5d4f;
          uStack_a70 = 0xbdfe5d4fbdfe5d4f;
          uStack_a68 = 0xbdfe5d4fbdfe5d4f;
          local_1120._0_4_ = (float)local_1120._0_4_ + -0.12420141;
          local_1120._4_4_ = (float)local_1120._4_4_ + -0.12420141;
          fVar70 = fVar70 + -0.12420141;
          fVar71 = fVar71 + -0.12420141;
          fVar72 = fVar72 + -0.12420141;
          fVar73 = fVar73 + -0.12420141;
          fVar74 = fVar74 + -0.12420141;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0xbd55d064;
          auVar7 = _local_1120;
          local_da0 = local_1120;
          uStack_d98 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_d90 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_d88 = uStack_1108;
          local_dc0 = local_1020;
          uStack_db8 = uStack_1018;
          uStack_db0 = uStack_1010;
          uStack_da8 = uStack_1008;
          local_1120._0_4_ = (float)local_1120._0_4_ * (float)local_9a0;
          local_1120._4_4_ = (float)local_1120._4_4_ * local_9a0._4_4_;
          fVar70 = fVar70 * (float)uStack_998;
          fVar71 = fVar71 * uStack_998._4_4_;
          fVar72 = fVar72 * (float)uStack_990;
          fVar73 = fVar73 * uStack_990._4_4_;
          fVar74 = fVar74 * (float)uStack_988;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0xbd55d064;
          auVar7 = _local_1120;
          local_aa0 = local_1120;
          uStack_a98 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_a90 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_a88 = uStack_1108;
          local_ac0 = 0x3e11e9bf3e11e9bf;
          uStack_ab8 = 0x3e11e9bf3e11e9bf;
          uStack_ab0 = 0x3e11e9bf3e11e9bf;
          uStack_aa8 = 0x3e11e9bf3e11e9bf;
          local_1120._0_4_ = (float)local_1120._0_4_ + 0.14249323;
          local_1120._4_4_ = (float)local_1120._4_4_ + 0.14249323;
          fVar70 = fVar70 + 0.14249323;
          fVar71 = fVar71 + 0.14249323;
          fVar72 = fVar72 + 0.14249323;
          fVar73 = fVar73 + 0.14249323;
          fVar74 = fVar74 + 0.14249323;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0x3db8eb4c;
          auVar7 = _local_1120;
          local_de0 = local_1120;
          uStack_dd8 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_dd0 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_dc8 = uStack_1108;
          local_e00 = local_1020;
          uStack_df8 = uStack_1018;
          uStack_df0 = uStack_1010;
          uStack_de8 = uStack_1008;
          local_1120._0_4_ = (float)local_1120._0_4_ * (float)local_9a0;
          local_1120._4_4_ = (float)local_1120._4_4_ * local_9a0._4_4_;
          fVar70 = fVar70 * (float)uStack_998;
          fVar71 = fVar71 * uStack_998._4_4_;
          fVar72 = fVar72 * (float)uStack_990;
          fVar73 = fVar73 * uStack_990._4_4_;
          fVar74 = fVar74 * (float)uStack_988;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0x3db8eb4c;
          auVar7 = _local_1120;
          local_ae0 = local_1120;
          uStack_ad8 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_ad0 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_ac8 = uStack_1108;
          local_b00 = 0xbe2aae50be2aae50;
          uStack_af8 = 0xbe2aae50be2aae50;
          uStack_af0 = 0xbe2aae50be2aae50;
          uStack_ae8 = 0xbe2aae50be2aae50;
          local_1120._0_4_ = (float)local_1120._0_4_ + -0.16668057;
          local_1120._4_4_ = (float)local_1120._4_4_ + -0.16668057;
          fVar70 = fVar70 + -0.16668057;
          fVar71 = fVar71 + -0.16668057;
          fVar72 = fVar72 + -0.16668057;
          fVar73 = fVar73 + -0.16668057;
          fVar74 = fVar74 + -0.16668057;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0xbd9c7154;
          auVar7 = _local_1120;
          local_e20 = local_1120;
          uStack_e18 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_e10 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_e08 = uStack_1108;
          local_e40 = local_1020;
          uStack_e38 = uStack_1018;
          uStack_e30 = uStack_1010;
          uStack_e28 = uStack_1008;
          local_1120._0_4_ = (float)local_1120._0_4_ * (float)local_9a0;
          local_1120._4_4_ = (float)local_1120._4_4_ * local_9a0._4_4_;
          fVar70 = fVar70 * (float)uStack_998;
          fVar71 = fVar71 * uStack_998._4_4_;
          fVar72 = fVar72 * (float)uStack_990;
          fVar73 = fVar73 * uStack_990._4_4_;
          fVar74 = fVar74 * (float)uStack_988;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0xbd9c7154;
          auVar7 = _local_1120;
          local_b20 = local_1120;
          uStack_b18 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_b10 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_b08 = uStack_1108;
          local_b40 = 0x3e4cceac3e4cceac;
          uStack_b38 = 0x3e4cceac3e4cceac;
          uStack_b30 = 0x3e4cceac3e4cceac;
          uStack_b28 = 0x3e4cceac3e4cceac;
          local_1120._0_4_ = (float)local_1120._0_4_ + 0.20000714;
          local_1120._4_4_ = (float)local_1120._4_4_ + 0.20000714;
          fVar70 = fVar70 + 0.20000714;
          fVar71 = fVar71 + 0.20000714;
          fVar72 = fVar72 + 0.20000714;
          fVar73 = fVar73 + 0.20000714;
          fVar74 = fVar74 + 0.20000714;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0x3dfd2c04;
          auVar7 = _local_1120;
          local_e60 = local_1120;
          uStack_e58 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_e50 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_e48 = uStack_1108;
          local_e80 = local_1020;
          uStack_e78 = uStack_1018;
          uStack_e70 = uStack_1010;
          uStack_e68 = uStack_1008;
          local_1120._0_4_ = (float)local_1120._0_4_ * (float)local_9a0;
          local_1120._4_4_ = (float)local_1120._4_4_ * local_9a0._4_4_;
          fVar70 = fVar70 * (float)uStack_998;
          fVar71 = fVar71 * uStack_998._4_4_;
          fVar72 = fVar72 * (float)uStack_990;
          fVar73 = fVar73 * uStack_990._4_4_;
          fVar74 = fVar74 * (float)uStack_988;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0x3dfd2c04;
          auVar7 = _local_1120;
          local_b60 = local_1120;
          uStack_b58 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_b50 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_b48 = uStack_1108;
          local_b80 = 0xbe7ffffcbe7ffffc;
          uStack_b78 = 0xbe7ffffcbe7ffffc;
          uStack_b70 = 0xbe7ffffcbe7ffffc;
          uStack_b68 = 0xbe7ffffcbe7ffffc;
          local_1120._0_4_ = (float)local_1120._0_4_ + -0.24999994;
          local_1120._4_4_ = (float)local_1120._4_4_ + -0.24999994;
          fVar70 = fVar70 + -0.24999994;
          fVar71 = fVar71 + -0.24999994;
          fVar72 = fVar72 + -0.24999994;
          fVar73 = fVar73 + -0.24999994;
          fVar74 = fVar74 + -0.24999994;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0xbe0169fa;
          auVar7 = _local_1120;
          local_ea0 = local_1120;
          uStack_e98 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_e90 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_e88 = uStack_1108;
          local_ec0 = local_1020;
          uStack_eb8 = uStack_1018;
          uStack_eb0 = uStack_1010;
          uStack_ea8 = uStack_1008;
          local_1120._0_4_ = (float)local_1120._0_4_ * (float)local_9a0;
          local_1120._4_4_ = (float)local_1120._4_4_ * local_9a0._4_4_;
          fVar70 = fVar70 * (float)uStack_998;
          fVar71 = fVar71 * uStack_998._4_4_;
          fVar72 = fVar72 * (float)uStack_990;
          fVar73 = fVar73 * uStack_990._4_4_;
          fVar74 = fVar74 * (float)uStack_988;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0xbe0169fa;
          auVar7 = _local_1120;
          local_ba0 = local_1120;
          uStack_b98 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_b90 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_b88 = uStack_1108;
          local_bc0 = 0x3eaaaaaa3eaaaaaa;
          uStack_bb8 = 0x3eaaaaaa3eaaaaaa;
          uStack_bb0 = 0x3eaaaaaa3eaaaaaa;
          uStack_ba8 = 0x3eaaaaaa3eaaaaaa;
          local_1120._0_4_ = (float)local_1120._0_4_ + 0.3333333;
          local_1120._4_4_ = (float)local_1120._4_4_ + 0.3333333;
          fVar70 = fVar70 + 0.3333333;
          fVar71 = fVar71 + 0.3333333;
          fVar72 = fVar72 + 0.3333333;
          fVar73 = fVar73 + 0.3333333;
          fVar74 = fVar74 + 0.3333333;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0x3e53eb5a;
          auVar7 = _local_1120;
          local_ee0 = local_1120;
          uStack_ed8 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_ed0 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_ec8 = uStack_1108;
          local_f00 = local_1020;
          uStack_ef8 = uStack_1018;
          uStack_ef0 = uStack_1010;
          uStack_ee8 = uStack_1008;
          local_1120._0_4_ = (float)local_1120._0_4_ * (float)local_9a0;
          local_1120._4_4_ = (float)local_1120._4_4_ * local_9a0._4_4_;
          fVar70 = fVar70 * (float)uStack_998;
          fVar71 = fVar71 * uStack_998._4_4_;
          fVar72 = fVar72 * (float)uStack_990;
          fVar73 = fVar73 * uStack_990._4_4_;
          fVar74 = fVar74 * (float)uStack_988;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0x3e53eb5a;
          auVar7 = _local_1120;
          local_f20 = local_1120;
          uStack_f18 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_f10 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_f08 = uStack_1108;
          local_f40 = CONCAT44(fStack_10fc,local_1100);
          uStack_f38 = CONCAT44(fStack_10f4,fStack_10f8);
          uStack_f30 = CONCAT44(fStack_10ec,fStack_10f0);
          uStack_f28 = CONCAT44(fStack_10e4,fStack_10e8);
          local_1120._0_4_ = (float)local_1120._0_4_ * local_1100;
          local_1120._4_4_ = (float)local_1120._4_4_ * fStack_10fc;
          fVar70 = fVar70 * fStack_10f8;
          fVar71 = fVar71 * fStack_10f4;
          fVar72 = fVar72 * fStack_10f0;
          fVar73 = fVar73 * fStack_10ec;
          fVar74 = fVar74 * fStack_10e8;
          uStack_1118._0_4_ = fVar70;
          uStack_1118._4_4_ = fVar71;
          uStack_1110._0_4_ = fVar72;
          uStack_1110._4_4_ = fVar73;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74;
          uStack_1108._4_4_ = 0x3e53eb5a;
          auVar7 = _local_1120;
          local_f80 = 0xb95e8083b95e8083;
          uStack_f78 = 0xb95e8083b95e8083;
          uStack_f70 = 0xb95e8083b95e8083;
          uStack_f68 = 0xb95e8083b95e8083;
          local_f60._0_4_ = local_10a0._0_4_;
          local_f60._4_4_ = local_10a0._4_4_;
          uStack_f58._0_4_ = local_10a0._8_4_;
          uStack_f58._4_4_ = local_10a0._12_4_;
          uStack_f50._0_4_ = local_10a0._16_4_;
          uStack_f50._4_4_ = local_10a0._20_4_;
          uStack_f48._0_4_ = local_10a0._24_4_;
          uStack_f48._4_4_ = local_10a0._28_4_;
          local_10e0._4_4_ = local_f60._4_4_ * -0.00021219444;
          local_10e0._0_4_ = (float)local_f60 * -0.00021219444;
          uStack_10d8._0_4_ = (float)uStack_f58 * -0.00021219444;
          uStack_10d8._4_4_ = uStack_f58._4_4_ * -0.00021219444;
          uStack_10d0._0_4_ = (float)uStack_f50 * -0.00021219444;
          uStack_10d0._4_4_ = uStack_f50._4_4_ * -0.00021219444;
          auVar62 = _local_10e0;
          uStack_10c8._0_4_ = (float)uStack_f48 * -0.00021219444;
          uStack_10c8._4_4_ = uStack_f48._4_4_;
          auVar8 = _local_10e0;
          local_be0 = local_1120;
          uStack_bd8 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_bd0 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_bc8 = uStack_1108;
          local_c00 = local_10e0;
          uStack_bf8 = uStack_10d8;
          uStack_10d0 = auVar62._16_8_;
          uStack_bf0 = uStack_10d0;
          uStack_10c8 = auVar8._24_8_;
          uStack_be8 = uStack_10c8;
          local_1120._4_4_ = (float)local_1120._4_4_ + local_f60._4_4_ * -0.00021219444;
          local_1120._0_4_ = (float)local_1120._0_4_ + (float)local_f60 * -0.00021219444;
          uStack_1118._0_4_ = fVar70 + (float)uStack_f58 * -0.00021219444;
          uStack_1118._4_4_ = fVar71 + uStack_f58._4_4_ * -0.00021219444;
          uStack_1110._0_4_ = fVar72 + (float)uStack_f50 * -0.00021219444;
          uStack_1110._4_4_ = fVar73 + uStack_f50._4_4_ * -0.00021219444;
          auVar61 = _local_1120;
          uStack_1108._0_4_ = fVar74 + (float)uStack_f48 * -0.00021219444;
          uStack_1108._4_4_ = uStack_f48._4_4_ + 0.20695248;
          auVar7 = _local_1120;
          local_fa0 = CONCAT44(fStack_10fc,local_1100);
          uStack_f98 = CONCAT44(fStack_10f4,fStack_10f8);
          uStack_f90 = CONCAT44(fStack_10ec,fStack_10f0);
          uStack_f88 = CONCAT44(fStack_10e4,fStack_10e8);
          local_fc0 = 0x3f0000003f000000;
          uStack_fb8 = 0x3f0000003f000000;
          uStack_fb0 = 0x3f0000003f000000;
          uStack_fa8 = 0x3f0000003f000000;
          local_10e0._4_4_ = fStack_10fc * 0.5;
          local_10e0._0_4_ = local_1100 * 0.5;
          uStack_10d8._0_4_ = fStack_10f8 * 0.5;
          uStack_10d8._4_4_ = fStack_10f4 * 0.5;
          uStack_10d0._0_4_ = fStack_10f0 * 0.5;
          uStack_10d0._4_4_ = fStack_10ec * 0.5;
          auVar62 = _local_10e0;
          uStack_10c8._0_4_ = fStack_10e8 * 0.5;
          uStack_10c8._4_4_ = fStack_10e4;
          auVar8 = _local_10e0;
          local_720 = local_1120;
          uStack_718 = uStack_1118;
          uStack_1110 = auVar61._16_8_;
          uStack_710 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uStack_708 = uStack_1108;
          local_740 = local_10e0;
          uStack_738 = uStack_10d8;
          uStack_10d0 = auVar62._16_8_;
          uStack_730 = uStack_10d0;
          uStack_10c8 = auVar8._24_8_;
          uStack_728 = uStack_10c8;
          auVar47._16_8_ = uStack_1110;
          auVar47._0_16_ = _local_1120;
          auVar47._24_8_ = uStack_1108;
          auVar46._16_8_ = uStack_10d0;
          auVar46._0_16_ = _local_10e0;
          auVar46._24_8_ = uStack_10c8;
          auVar7 = vsubps_avx(auVar47,auVar46);
          local_fe0 = local_10a0;
          uStack_fd8 = uStack_1098;
          uStack_fd0 = uStack_1090;
          uStack_fc8 = uStack_1088;
          local_1000 = 0x3f3180003f318000;
          uStack_ff8 = 0x3f3180003f318000;
          uStack_ff0 = 0x3f3180003f318000;
          uStack_fe8 = 0x3f3180003f318000;
          local_10e0._4_4_ = local_f60._4_4_ * 0.6933594;
          local_10e0._0_4_ = (float)local_f60 * 0.6933594;
          uStack_10d8._0_4_ = (float)uStack_f58 * 0.6933594;
          uStack_10d8._4_4_ = uStack_f58._4_4_ * 0.6933594;
          uStack_10d0._0_4_ = (float)uStack_f50 * 0.6933594;
          uStack_10d0._4_4_ = uStack_f50._4_4_ * 0.6933594;
          auVar61 = _local_10e0;
          uStack_10c8._0_4_ = (float)uStack_f48 * 0.6933594;
          uStack_10c8._4_4_ = uStack_f48._4_4_;
          auVar40 = _local_10e0;
          local_c20 = local_1020;
          uStack_c18 = uStack_1018;
          uStack_c10 = uStack_1010;
          uStack_c08 = uStack_1008;
          local_1120 = auVar7._0_8_;
          uVar30 = local_1120;
          uStack_1118 = auVar7._8_8_;
          uVar31 = uStack_1118;
          uStack_1110 = auVar7._16_8_;
          uVar32 = uStack_1110;
          uStack_1108 = auVar7._24_8_;
          uVar33 = uStack_1108;
          local_c40._0_4_ = auVar7._0_4_;
          local_c40._4_4_ = auVar7._4_4_;
          uStack_c38._0_4_ = auVar7._8_4_;
          uStack_c38._4_4_ = auVar7._12_4_;
          uStack_c30._0_4_ = auVar7._16_4_;
          uStack_c30._4_4_ = auVar7._20_4_;
          uStack_c28._0_4_ = auVar7._24_4_;
          uStack_c28._4_4_ = auVar7._28_4_;
          local_1020._4_4_ = local_9a0._4_4_ + local_c40._4_4_;
          local_1020._0_4_ = (float)local_9a0 + (float)local_c40;
          uStack_1018._0_4_ = (float)uStack_998 + (float)uStack_c38;
          uStack_1018._4_4_ = uStack_998._4_4_ + uStack_c38._4_4_;
          uStack_1010._0_4_ = (float)uStack_990 + (float)uStack_c30;
          uStack_1010._4_4_ = uStack_990._4_4_ + uStack_c30._4_4_;
          auVar62 = _local_1020;
          uStack_1008._0_4_ = (float)uStack_988 + (float)uStack_c28;
          uStack_1008._4_4_ = fStack_10e4 + uStack_c28._4_4_;
          auVar7 = _local_1020;
          local_c60 = local_1020;
          uStack_c58 = uStack_1018;
          uStack_1010 = auVar62._16_8_;
          uStack_c50 = uStack_1010;
          uStack_1008 = auVar7._24_8_;
          uStack_c48 = uStack_1008;
          local_c80 = local_10e0;
          uStack_c78 = uStack_10d8;
          uStack_10d0 = auVar61._16_8_;
          uStack_c70 = uStack_10d0;
          uStack_10c8 = auVar40._24_8_;
          uStack_c68 = uStack_10c8;
          local_1020._4_4_ = local_9a0._4_4_ + local_c40._4_4_ + local_f60._4_4_ * 0.6933594;
          local_1020._0_4_ = (float)local_9a0 + (float)local_c40 + (float)local_f60 * 0.6933594;
          uStack_1018._0_4_ = (float)uStack_998 + (float)uStack_c38 + (float)uStack_f58 * 0.6933594;
          uStack_1018._4_4_ = uStack_998._4_4_ + uStack_c38._4_4_ + uStack_f58._4_4_ * 0.6933594;
          uStack_1010._0_4_ = (float)uStack_990 + (float)uStack_c30 + (float)uStack_f50 * 0.6933594;
          uStack_1010._4_4_ = uStack_990._4_4_ + uStack_c30._4_4_ + uStack_f50._4_4_ * 0.6933594;
          auVar61 = _local_1020;
          uStack_1008._0_4_ = (float)uStack_988 + (float)uStack_c28 + (float)uStack_f48 * 0.6933594;
          uStack_1008._4_4_ = fStack_10e4 + uStack_c28._4_4_ + uStack_f48._4_4_;
          auVar41 = _local_1020;
          local_240 = local_1020;
          uStack_238 = uStack_1018;
          uStack_1010 = auVar61._16_8_;
          uStack_230 = uStack_1010;
          uStack_1008 = auVar41._24_8_;
          uStack_228 = uStack_1008;
          local_260 = local_1080._0_8_;
          uStack_258 = local_1080._8_8_;
          uStack_250 = local_1080._16_8_;
          uStack_248 = local_1080._24_8_;
          auVar56._16_8_ = uStack_1010;
          auVar56._0_16_ = _local_1020;
          auVar56._24_8_ = uStack_1008;
          _local_1120 = vorps_avx(auVar56,local_1080);
          local_17e0._0_4_ = auVar6._0_4_;
          local_17e0._4_4_ = auVar6._4_4_;
          uStack_17d8._0_4_ = auVar6._8_4_;
          uStack_17d8._4_4_ = auVar6._12_4_;
          uStack_17d0._0_4_ = auVar5._0_4_;
          uStack_17d0._4_4_ = auVar5._4_4_;
          uStack_17c8._0_4_ = auVar5._8_4_;
          uStack_17c8._4_4_ = auVar5._12_4_;
          local_1800._0_4_ = local_1120._0_4_;
          local_1800._4_4_ = local_1120._4_4_;
          uStack_17f8._0_4_ = local_1120._8_4_;
          uStack_17f8._4_4_ = local_1120._12_4_;
          uStack_17f0._0_4_ = local_1120._16_4_;
          uStack_17f0._4_4_ = local_1120._20_4_;
          uStack_17e8._0_4_ = local_1120._24_4_;
          local_1600._4_4_ = local_17e0._4_4_ * local_1800._4_4_;
          local_1600._0_4_ = (float)local_17e0 * (float)local_1800;
          uStack_15f8._0_4_ = (float)uStack_17d8 * (float)uStack_17f8;
          uStack_15f8._4_4_ = uStack_17d8._4_4_ * uStack_17f8._4_4_;
          uStack_15f0._0_4_ = (float)uStack_17d0 * (float)uStack_17f0;
          uStack_15f0._4_4_ = uStack_17d0._4_4_ * uStack_17f0._4_4_;
          auVar61 = _local_1600;
          uStack_15e8._0_4_ = (float)uStack_17c8 * (float)uStack_17e8;
          uStack_15e8._4_4_ = uStack_17c8._4_4_;
          auVar7 = _local_1600;
          local_920 = ZEXT432(0) << 0x20;
          local_1680 = 0x3f8000003f800000;
          uStack_1678 = 0x3f8000003f800000;
          uStack_1670 = 0x3f8000003f800000;
          uStack_1668 = 0x3f8000003f800000;
          local_8e0 = local_1600;
          uStack_8d8 = uStack_15f8;
          uStack_15f0 = auVar61._16_8_;
          uStack_8d0 = uStack_15f0;
          uStack_15e8 = auVar7._24_8_;
          uStack_8c8 = uStack_15e8;
          local_900 = 0x42b0c0a542b0c0a5;
          uStack_8f8 = 0x42b0c0a542b0c0a5;
          uStack_8f0 = 0x42b0c0a542b0c0a5;
          uStack_8e8 = 0x42b0c0a542b0c0a5;
          auVar39._16_8_ = uStack_15f0;
          auVar39._0_16_ = _local_1600;
          auVar39._24_8_ = uStack_15e8;
          auVar38._8_8_ = 0x42b0c0a542b0c0a5;
          auVar38._0_8_ = 0x42b0c0a542b0c0a5;
          auVar38._16_8_ = 0x42b0c0a542b0c0a5;
          auVar38._24_8_ = 0x42b0c0a542b0c0a5;
          auVar7 = vminps_avx(auVar39,auVar38);
          local_1600 = auVar7._0_8_;
          local_860 = local_1600;
          uStack_15f8 = auVar7._8_8_;
          uStack_858 = uStack_15f8;
          uStack_15f0 = auVar7._16_8_;
          uStack_850 = uStack_15f0;
          uStack_15e8 = auVar7._24_8_;
          uStack_848 = uStack_15e8;
          local_880 = 0xc2b0c0a5c2b0c0a5;
          uStack_878 = 0xc2b0c0a5c2b0c0a5;
          uStack_870 = 0xc2b0c0a5c2b0c0a5;
          uStack_868 = 0xc2b0c0a5c2b0c0a5;
          auVar42._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar42._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar42._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar42._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar8 = vmaxps_avx(auVar7,auVar42);
          local_1600 = auVar8._0_8_;
          uVar34 = local_1600;
          uStack_15f8 = auVar8._8_8_;
          uVar35 = uStack_15f8;
          uStack_15f0 = auVar8._16_8_;
          uVar36 = uStack_15f0;
          uStack_15e8 = auVar8._24_8_;
          uVar37 = uStack_15e8;
          local_1360 = 0x3fb8aa3b3fb8aa3b;
          uStack_1358 = 0x3fb8aa3b3fb8aa3b;
          uStack_1350 = 0x3fb8aa3b3fb8aa3b;
          uStack_1348 = 0x3fb8aa3b3fb8aa3b;
          local_1340._0_4_ = auVar8._0_4_;
          local_1340._4_4_ = auVar8._4_4_;
          uStack_1338._0_4_ = auVar8._8_4_;
          uStack_1338._4_4_ = auVar8._12_4_;
          uStack_1330._0_4_ = auVar8._16_4_;
          uStack_1330._4_4_ = auVar8._20_4_;
          uStack_1328._0_4_ = auVar8._24_4_;
          uStack_1328._4_4_ = auVar8._28_4_;
          local_1640._4_4_ = local_1340._4_4_ * 1.442695;
          local_1640._0_4_ = (float)local_1340 * 1.442695;
          uStack_1638._0_4_ = (float)uStack_1338 * 1.442695;
          uStack_1638._4_4_ = uStack_1338._4_4_ * 1.442695;
          uStack_1630._0_4_ = (float)uStack_1330 * 1.442695;
          uStack_1630._4_4_ = uStack_1330._4_4_ * 1.442695;
          auVar61 = _local_1640;
          uStack_1628._0_4_ = (float)uStack_1328 * 1.442695;
          uStack_1628._4_4_ = uStack_1328._4_4_;
          auVar7 = _local_1640;
          local_1140 = local_1640;
          uStack_1138 = uStack_1638;
          uStack_1630 = auVar61._16_8_;
          uStack_1130 = uStack_1630;
          uStack_1628 = auVar7._24_8_;
          uStack_1128 = uStack_1628;
          local_12a0 = 0x3f0000003f000000;
          uStack_1298 = 0x3f0000003f000000;
          uStack_1290 = 0x3f0000003f000000;
          uStack_1288 = 0x3f0000003f000000;
          local_1640._4_4_ = local_1340._4_4_ * 1.442695 + 0.5;
          local_1640._0_4_ = (float)local_1340 * 1.442695 + 0.5;
          uStack_1638._0_4_ = (float)uStack_1338 * 1.442695 + 0.5;
          uStack_1638._4_4_ = uStack_1338._4_4_ * 1.442695 + 0.5;
          uStack_1630._0_4_ = (float)uStack_1330 * 1.442695 + 0.5;
          uStack_1630._4_4_ = uStack_1330._4_4_ * 1.442695 + 0.5;
          uStack_1628._0_4_ = (float)uStack_1328 * 1.442695 + 0.5;
          uStack_1628._4_4_ = uStack_1328._4_4_ + 0.5;
          auVar9 = vroundps_avx(_local_1640,1);
          auVar7 = vcmpps_avx(_local_1640,auVar9,1);
          local_16a0._0_8_ = auVar7._0_8_;
          local_760 = local_16a0._0_8_;
          local_16a0._8_8_ = auVar7._8_8_;
          uStack_758 = local_16a0._8_8_;
          local_16a0._16_8_ = auVar7._16_8_;
          uStack_750 = local_16a0._16_8_;
          local_16a0._24_8_ = auVar7._24_8_;
          uStack_748 = local_16a0._24_8_;
          local_780 = 0x3f8000003f800000;
          uStack_778 = 0x3f8000003f800000;
          uStack_770 = 0x3f8000003f800000;
          uStack_768 = 0x3f8000003f800000;
          auVar45._8_8_ = 0x3f8000003f800000;
          auVar45._0_8_ = 0x3f8000003f800000;
          auVar45._16_8_ = 0x3f8000003f800000;
          auVar45._24_8_ = 0x3f8000003f800000;
          local_16a0 = vandps_avx(auVar7,auVar45);
          local_1620 = auVar9._0_8_;
          local_5e0 = local_1620;
          uStack_1618 = auVar9._8_8_;
          uStack_5d8 = uStack_1618;
          uStack_1610 = auVar9._16_8_;
          uStack_5d0 = uStack_1610;
          uStack_1608 = auVar9._24_8_;
          uStack_5c8 = uStack_1608;
          local_600 = local_16a0._0_8_;
          uStack_5f8 = local_16a0._8_8_;
          uStack_5f0 = local_16a0._16_8_;
          uStack_5e8 = local_16a0._24_8_;
          _local_1640 = vsubps_avx(auVar9,local_16a0);
          local_13a0 = 0x3f3180003f318000;
          uStack_1398 = 0x3f3180003f318000;
          uStack_1390 = 0x3f3180003f318000;
          uStack_1388 = 0x3f3180003f318000;
          local_1380._0_4_ = local_1640._0_4_;
          local_1380._4_4_ = local_1640._4_4_;
          uStack_1378._0_4_ = local_1640._8_4_;
          uStack_1378._4_4_ = local_1640._12_4_;
          uStack_1370._0_4_ = local_1640._16_4_;
          uStack_1370._4_4_ = local_1640._20_4_;
          uStack_1368._0_4_ = local_1640._24_4_;
          uStack_1368._4_4_ = local_1640._28_4_;
          local_1620._4_4_ = local_1380._4_4_ * 0.6933594;
          local_1620._0_4_ = (float)local_1380 * 0.6933594;
          uStack_1618._0_4_ = (float)uStack_1378 * 0.6933594;
          uStack_1618._4_4_ = uStack_1378._4_4_ * 0.6933594;
          uStack_1610._0_4_ = (float)uStack_1370 * 0.6933594;
          uStack_1610._4_4_ = uStack_1370._4_4_ * 0.6933594;
          auVar61 = _local_1620;
          uStack_1608._0_4_ = (float)uStack_1368 * 0.6933594;
          uStack_1608._4_4_ = uStack_1368._4_4_;
          auVar38 = _local_1620;
          local_13c0 = local_1640;
          uStack_13b8 = uStack_1638;
          uStack_13b0 = uStack_1630;
          uStack_13a8 = uStack_1628;
          local_13e0 = 0xb95e8083b95e8083;
          uStack_13d8 = 0xb95e8083b95e8083;
          uStack_13d0 = 0xb95e8083b95e8083;
          uStack_13c8 = 0xb95e8083b95e8083;
          local_620 = local_1600;
          uStack_618 = uStack_15f8;
          uStack_610 = uStack_15f0;
          uStack_608 = uStack_15e8;
          local_640 = local_1620;
          uStack_638 = uStack_1618;
          uStack_1610 = auVar61._16_8_;
          uStack_630 = uStack_1610;
          uStack_1608 = auVar38._24_8_;
          uStack_628 = uStack_1608;
          auVar51._16_8_ = uStack_1610;
          auVar51._0_16_ = _local_1620;
          auVar51._24_8_ = uStack_1608;
          auVar7 = vsubps_avx(auVar8,auVar51);
          local_1600 = auVar7._0_8_;
          local_660 = local_1600;
          uStack_15f8 = auVar7._8_8_;
          uStack_658 = uStack_15f8;
          uStack_15f0 = auVar7._16_8_;
          uStack_650 = uStack_15f0;
          uStack_15e8 = auVar7._24_8_;
          uStack_648 = uStack_15e8;
          local_680 = CONCAT44(local_1380._4_4_ * -0.00021219444,(float)local_1380 * -0.00021219444)
          ;
          uStack_678 = CONCAT44(uStack_1378._4_4_ * -0.00021219444,
                                (float)uStack_1378 * -0.00021219444);
          uStack_670 = CONCAT44(uStack_1370._4_4_ * -0.00021219444,
                                (float)uStack_1370 * -0.00021219444);
          uStack_668 = CONCAT44(uStack_1368._4_4_,(float)uStack_1368 * -0.00021219444);
          auVar50._8_8_ = uStack_678;
          auVar50._0_8_ = local_680;
          auVar50._16_8_ = uStack_670;
          auVar50._24_8_ = uStack_668;
          _local_1600 = vsubps_avx(auVar7,auVar50);
          local_1420 = local_1600;
          uStack_1418 = uStack_15f8;
          uStack_1410 = uStack_15f0;
          uStack_1408 = uStack_15e8;
          local_1400._0_4_ = local_1600._0_4_;
          local_1400._4_4_ = local_1600._4_4_;
          uStack_13f8._0_4_ = local_1600._8_4_;
          uStack_13f8._4_4_ = local_1600._12_4_;
          uStack_13f0._0_4_ = local_1600._16_4_;
          uStack_13f0._4_4_ = local_1600._20_4_;
          uStack_13e8._0_4_ = local_1600._24_4_;
          uStack_13e8._4_4_ = local_1600._28_4_;
          fStack_16a4 = uStack_13e8._4_4_;
          local_16c0 = (float)local_1400 * (float)local_1400;
          fStack_16bc = local_1400._4_4_ * local_1400._4_4_;
          fStack_16b8 = (float)uStack_13f8 * (float)uStack_13f8;
          fStack_16b4 = uStack_13f8._4_4_ * uStack_13f8._4_4_;
          fStack_16b0 = (float)uStack_13f0 * (float)uStack_13f0;
          fStack_16ac = uStack_13f0._4_4_ * uStack_13f0._4_4_;
          fStack_16a8 = (float)uStack_13e8 * (float)uStack_13e8;
          local_1440 = 0x3950696739506967;
          uStack_1438 = 0x3950696739506967;
          uStack_1430 = 0x3950696739506967;
          uStack_1428 = 0x3950696739506967;
          local_1460 = local_1600;
          uStack_1458 = uStack_15f8;
          uStack_1450 = uStack_15f0;
          uStack_1448 = uStack_15e8;
          local_16e0 = CONCAT44(local_1400._4_4_ * 0.00019875691,(float)local_1400 * 0.00019875691);
          uStack_16d8 = CONCAT44(uStack_13f8._4_4_ * 0.00019875691,
                                 (float)uStack_13f8 * 0.00019875691);
          uStack_16d0 = CONCAT44(uStack_13f0._4_4_ * 0.00019875691,
                                 (float)uStack_13f0 * 0.00019875691);
          uStack_16c8 = CONCAT44(0x39506967,(float)uStack_13e8 * 0.00019875691);
          local_1180 = local_16e0;
          uStack_1178 = uStack_16d8;
          uStack_1170 = uStack_16d0;
          uStack_1168 = uStack_16c8;
          local_11a0 = 0x3ab743ce3ab743ce;
          uStack_1198 = 0x3ab743ce3ab743ce;
          uStack_1190 = 0x3ab743ce3ab743ce;
          uStack_1188 = 0x3ab743ce3ab743ce;
          fVar70 = (float)local_1400 * 0.00019875691 + 0.0013981999;
          fVar71 = local_1400._4_4_ * 0.00019875691 + 0.0013981999;
          fVar72 = (float)uStack_13f8 * 0.00019875691 + 0.0013981999;
          fVar73 = uStack_13f8._4_4_ * 0.00019875691 + 0.0013981999;
          fVar74 = (float)uStack_13f0 * 0.00019875691 + 0.0013981999;
          fVar76 = uStack_13f0._4_4_ * 0.00019875691 + 0.0013981999;
          fVar77 = (float)uStack_13e8 * 0.00019875691 + 0.0013981999;
          local_16e0 = CONCAT44(fVar71,fVar70);
          uStack_16d8 = CONCAT44(fVar73,fVar72);
          uStack_16d0 = CONCAT44(fVar76,fVar74);
          uStack_16c8 = CONCAT44(0x3ad150fb,fVar77);
          local_1480 = local_16e0;
          uStack_1478 = uStack_16d8;
          uStack_1470 = uStack_16d0;
          uStack_1468 = uStack_16c8;
          local_14a0 = local_1600;
          uStack_1498 = uStack_15f8;
          uStack_1490 = uStack_15f0;
          uStack_1488 = uStack_15e8;
          fVar70 = fVar70 * (float)local_1400;
          fVar71 = fVar71 * local_1400._4_4_;
          fVar72 = fVar72 * (float)uStack_13f8;
          fVar73 = fVar73 * uStack_13f8._4_4_;
          fVar74 = fVar74 * (float)uStack_13f0;
          fVar76 = fVar76 * uStack_13f0._4_4_;
          fVar77 = fVar77 * (float)uStack_13e8;
          local_16e0 = CONCAT44(fVar71,fVar70);
          uStack_16d8 = CONCAT44(fVar73,fVar72);
          uStack_16d0 = CONCAT44(fVar76,fVar74);
          uStack_16c8 = CONCAT44(0x3ad150fb,fVar77);
          local_11c0 = local_16e0;
          uStack_11b8 = uStack_16d8;
          uStack_11b0 = uStack_16d0;
          uStack_11a8 = uStack_16c8;
          local_11e0 = 0x3c0889083c088908;
          uStack_11d8 = 0x3c0889083c088908;
          uStack_11d0 = 0x3c0889083c088908;
          uStack_11c8 = 0x3c0889083c088908;
          fVar70 = fVar70 + 0.008333452;
          fVar71 = fVar71 + 0.008333452;
          fVar72 = fVar72 + 0.008333452;
          fVar73 = fVar73 + 0.008333452;
          fVar74 = fVar74 + 0.008333452;
          fVar76 = fVar76 + 0.008333452;
          fVar77 = fVar77 + 0.008333452;
          local_16e0 = CONCAT44(fVar71,fVar70);
          uStack_16d8 = CONCAT44(fVar73,fVar72);
          uStack_16d0 = CONCAT44(fVar76,fVar74);
          uStack_16c8 = CONCAT44(0x3c22b327,fVar77);
          local_14c0 = local_16e0;
          uStack_14b8 = uStack_16d8;
          uStack_14b0 = uStack_16d0;
          uStack_14a8 = uStack_16c8;
          local_14e0 = local_1600;
          uStack_14d8 = uStack_15f8;
          uStack_14d0 = uStack_15f0;
          uStack_14c8 = uStack_15e8;
          fVar70 = fVar70 * (float)local_1400;
          fVar71 = fVar71 * local_1400._4_4_;
          fVar72 = fVar72 * (float)uStack_13f8;
          fVar73 = fVar73 * uStack_13f8._4_4_;
          fVar74 = fVar74 * (float)uStack_13f0;
          fVar76 = fVar76 * uStack_13f0._4_4_;
          fVar77 = fVar77 * (float)uStack_13e8;
          local_16e0 = CONCAT44(fVar71,fVar70);
          uStack_16d8 = CONCAT44(fVar73,fVar72);
          uStack_16d0 = CONCAT44(fVar76,fVar74);
          uStack_16c8 = CONCAT44(0x3c22b327,fVar77);
          local_1200 = local_16e0;
          uStack_11f8 = uStack_16d8;
          uStack_11f0 = uStack_16d0;
          uStack_11e8 = uStack_16c8;
          local_1220 = 0x3d2aa9c13d2aa9c1;
          uStack_1218 = 0x3d2aa9c13d2aa9c1;
          uStack_1210 = 0x3d2aa9c13d2aa9c1;
          uStack_1208 = 0x3d2aa9c13d2aa9c1;
          fVar70 = fVar70 + 0.041665796;
          fVar71 = fVar71 + 0.041665796;
          fVar72 = fVar72 + 0.041665796;
          fVar73 = fVar73 + 0.041665796;
          fVar74 = fVar74 + 0.041665796;
          fVar76 = fVar76 + 0.041665796;
          fVar77 = fVar77 + 0.041665796;
          local_16e0 = CONCAT44(fVar71,fVar70);
          uStack_16d8 = CONCAT44(fVar73,fVar72);
          uStack_16d0 = CONCAT44(fVar76,fVar74);
          uStack_16c8 = CONCAT44(0x3d53568b,fVar77);
          local_1500 = local_16e0;
          uStack_14f8 = uStack_16d8;
          uStack_14f0 = uStack_16d0;
          uStack_14e8 = uStack_16c8;
          local_1520 = local_1600;
          uStack_1518 = uStack_15f8;
          uStack_1510 = uStack_15f0;
          uStack_1508 = uStack_15e8;
          fVar70 = fVar70 * (float)local_1400;
          fVar71 = fVar71 * local_1400._4_4_;
          fVar72 = fVar72 * (float)uStack_13f8;
          fVar73 = fVar73 * uStack_13f8._4_4_;
          fVar74 = fVar74 * (float)uStack_13f0;
          fVar76 = fVar76 * uStack_13f0._4_4_;
          fVar77 = fVar77 * (float)uStack_13e8;
          local_16e0 = CONCAT44(fVar71,fVar70);
          uStack_16d8 = CONCAT44(fVar73,fVar72);
          uStack_16d0 = CONCAT44(fVar76,fVar74);
          uStack_16c8 = CONCAT44(0x3d53568b,fVar77);
          local_1240 = local_16e0;
          uStack_1238 = uStack_16d8;
          uStack_1230 = uStack_16d0;
          uStack_1228 = uStack_16c8;
          local_1260 = 0x3e2aaaaa3e2aaaaa;
          uStack_1258 = 0x3e2aaaaa3e2aaaaa;
          uStack_1250 = 0x3e2aaaaa3e2aaaaa;
          uStack_1248 = 0x3e2aaaaa3e2aaaaa;
          fVar70 = fVar70 + 0.16666666;
          fVar71 = fVar71 + 0.16666666;
          fVar72 = fVar72 + 0.16666666;
          fVar73 = fVar73 + 0.16666666;
          fVar74 = fVar74 + 0.16666666;
          fVar76 = fVar76 + 0.16666666;
          fVar77 = fVar77 + 0.16666666;
          local_16e0 = CONCAT44(fVar71,fVar70);
          uStack_16d8 = CONCAT44(fVar73,fVar72);
          uStack_16d0 = CONCAT44(fVar76,fVar74);
          uStack_16c8 = CONCAT44(0x3e5f804d,fVar77);
          local_1540 = local_16e0;
          uStack_1538 = uStack_16d8;
          uStack_1530 = uStack_16d0;
          uStack_1528 = uStack_16c8;
          local_1560 = local_1600;
          uStack_1558 = uStack_15f8;
          uStack_1550 = uStack_15f0;
          uStack_1548 = uStack_15e8;
          fVar70 = fVar70 * (float)local_1400;
          fVar71 = fVar71 * local_1400._4_4_;
          fVar72 = fVar72 * (float)uStack_13f8;
          fVar73 = fVar73 * uStack_13f8._4_4_;
          fVar74 = fVar74 * (float)uStack_13f0;
          fVar76 = fVar76 * uStack_13f0._4_4_;
          fVar77 = fVar77 * (float)uStack_13e8;
          local_16e0 = CONCAT44(fVar71,fVar70);
          uStack_16d8 = CONCAT44(fVar73,fVar72);
          uStack_16d0 = CONCAT44(fVar76,fVar74);
          uStack_16c8 = CONCAT44(0x3e5f804d,fVar77);
          local_1280 = local_16e0;
          uStack_1278 = uStack_16d8;
          uStack_1270 = uStack_16d0;
          uStack_1268 = uStack_16c8;
          fVar70 = fVar70 + 0.5;
          fVar71 = fVar71 + 0.5;
          fVar72 = fVar72 + 0.5;
          fVar73 = fVar73 + 0.5;
          fVar74 = fVar74 + 0.5;
          fVar76 = fVar76 + 0.5;
          fVar77 = fVar77 + 0.5;
          local_16e0 = CONCAT44(fVar71,fVar70);
          uStack_16d8 = CONCAT44(fVar73,fVar72);
          uStack_16d0 = CONCAT44(fVar76,fVar74);
          uStack_16c8 = CONCAT44(0x3f37e013,fVar77);
          local_1580 = local_16e0;
          uStack_1578 = uStack_16d8;
          uStack_1570 = uStack_16d0;
          uStack_1568 = uStack_16c8;
          local_15a0 = CONCAT44(fStack_16bc,local_16c0);
          uStack_1598 = CONCAT44(fStack_16b4,fStack_16b8);
          uStack_1590 = CONCAT44(fStack_16ac,fStack_16b0);
          uStack_1588 = CONCAT44(uStack_13e8._4_4_,fStack_16a8);
          fVar70 = fVar70 * local_16c0;
          fVar71 = fVar71 * fStack_16bc;
          fVar72 = fVar72 * fStack_16b8;
          fVar73 = fVar73 * fStack_16b4;
          fVar74 = fVar74 * fStack_16b0;
          fVar76 = fVar76 * fStack_16ac;
          fVar77 = fVar77 * fStack_16a8;
          local_16e0 = CONCAT44(fVar71,fVar70);
          uStack_16d8 = CONCAT44(fVar73,fVar72);
          uStack_16d0 = CONCAT44(fVar76,fVar74);
          uStack_16c8 = CONCAT44(0x3f37e013,fVar77);
          local_12c0 = local_16e0;
          uStack_12b8 = uStack_16d8;
          uStack_12b0 = uStack_16d0;
          uStack_12a8 = uStack_16c8;
          local_12e0 = local_1600;
          uStack_12d8 = uStack_15f8;
          uStack_12d0 = uStack_15f0;
          uStack_12c8 = uStack_15e8;
          fVar70 = fVar70 + (float)local_1400;
          fVar71 = fVar71 + local_1400._4_4_;
          fVar72 = fVar72 + (float)uStack_13f8;
          fVar73 = fVar73 + uStack_13f8._4_4_;
          fVar74 = fVar74 + (float)uStack_13f0;
          fVar76 = fVar76 + uStack_13f0._4_4_;
          fVar77 = fVar77 + (float)uStack_13e8;
          local_16e0 = CONCAT44(fVar71,fVar70);
          uStack_16d8 = CONCAT44(fVar73,fVar72);
          uStack_16d0 = CONCAT44(fVar76,fVar74);
          uStack_16c8 = CONCAT44(uStack_13e8._4_4_ + 0.71826285,fVar77);
          local_1300 = local_16e0;
          uStack_12f8 = uStack_16d8;
          uStack_12f0 = uStack_16d0;
          uStack_12e8 = uStack_16c8;
          local_1320 = 0x3f8000003f800000;
          uStack_1318 = 0x3f8000003f800000;
          uStack_1310 = 0x3f8000003f800000;
          uStack_1308 = 0x3f8000003f800000;
          fVar70 = fVar70 + 1.0;
          fVar71 = fVar71 + 1.0;
          fVar72 = fVar72 + 1.0;
          fVar73 = fVar73 + 1.0;
          fVar74 = fVar74 + 1.0;
          fVar76 = fVar76 + 1.0;
          fVar77 = fVar77 + 1.0;
          fVar75 = uStack_13e8._4_4_ + 0.71826285 + 1.0;
          local_16e0 = CONCAT44(fVar71,fVar70);
          uStack_16d8 = CONCAT44(fVar73,fVar72);
          uStack_16d0 = CONCAT44(fVar76,fVar74);
          uStack_16c8 = CONCAT44(fVar75,fVar77);
          local_5c0 = local_1640;
          uStack_5b8 = uStack_1638;
          uStack_5b0 = uStack_1630;
          uStack_5a8 = uStack_1628;
          local_1660 = CONCAT44((int)local_1380._4_4_,(int)(float)local_1380);
          uStack_1658 = CONCAT44((int)uStack_1378._4_4_,(int)(float)uStack_1378);
          uStack_1650 = CONCAT44((int)uStack_1370._4_4_,(int)(float)uStack_1370);
          uStack_1648 = CONCAT44((int)uStack_1368._4_4_,(int)(float)uStack_1368);
          local_4c0 = local_1660;
          uStack_4b8 = uStack_1658;
          uStack_4b0 = uStack_1650;
          uStack_4a8 = uStack_1648;
          local_4e0 = 0x7f0000007f;
          uStack_4d8 = 0x7f0000007f;
          uStack_4d0 = 0x7f0000007f;
          uStack_4c8 = 0x7f0000007f;
          local_560 = local_1660;
          uStack_558 = uStack_1658;
          uStack_550 = uStack_1650;
          uStack_548 = uStack_1648;
          local_580 = 0x7f0000007f;
          uStack_578 = 0x7f0000007f;
          uStack_570 = 0x7f0000007f;
          uStack_568 = 0x7f0000007f;
          local_510 = 0x7f0000007f;
          uStack_508 = 0x7f0000007f;
          local_520 = 0x7f0000007f;
          uStack_518 = 0x7f0000007f;
          local_390 = local_1660;
          uStack_388 = uStack_1658;
          local_3a0 = 0x7f0000007f;
          uStack_398 = 0x7f0000007f;
          auVar55._8_8_ = uStack_1658;
          auVar55._0_8_ = local_1660;
          auVar54._8_8_ = 0x7f0000007f;
          auVar54._0_8_ = 0x7f0000007f;
          local_4f0 = vpaddd_avx(auVar55,auVar54);
          local_3b0 = uStack_1650;
          uStack_3a8 = uStack_1648;
          local_3c0 = 0x7f0000007f;
          uStack_3b8 = 0x7f0000007f;
          auVar53._8_8_ = uStack_1648;
          auVar53._0_8_ = uStack_1650;
          auVar52._8_8_ = 0x7f0000007f;
          auVar52._0_8_ = 0x7f0000007f;
          local_500 = vpaddd_avx(auVar53,auVar52);
          local_5a0 = local_4f0._0_8_;
          uStack_598 = local_4f0._8_8_;
          uStack_590 = local_500._0_8_;
          uStack_588 = local_500._8_8_;
          local_540 = local_4f0._0_8_;
          uStack_538 = local_4f0._8_8_;
          uStack_530 = local_500._0_8_;
          uStack_528 = local_500._8_8_;
          local_400 = local_4f0._0_8_;
          uStack_3f8 = local_4f0._8_8_;
          uStack_3f0 = local_500._0_8_;
          uStack_3e8 = local_500._8_8_;
          local_404 = 0x17;
          local_480 = local_4f0._0_8_;
          uStack_478 = local_4f0._8_8_;
          uStack_470 = local_500._0_8_;
          uStack_468 = local_500._8_8_;
          local_350 = local_4f0._0_8_;
          uStack_348 = local_4f0._8_8_;
          local_354 = 0x17;
          local_420 = vpslld_avx(local_4f0,ZEXT416(0x17));
          local_370 = local_500._0_8_;
          uStack_368 = local_500._8_8_;
          local_374 = 0x17;
          local_430 = vpslld_avx(local_500,ZEXT416(0x17));
          local_4a0 = local_420._0_8_;
          uStack_498 = local_420._8_8_;
          uStack_490 = local_430._0_8_;
          uStack_488 = local_430._8_8_;
          local_460 = local_420._0_8_;
          uStack_458 = local_420._8_8_;
          uStack_450 = local_430._0_8_;
          uStack_448 = local_430._8_8_;
          local_1660 = local_420._0_8_;
          uStack_1658 = local_420._8_8_;
          uStack_1650 = local_430._0_8_;
          uStack_1648 = local_430._8_8_;
          local_3e0 = local_420._0_8_;
          uStack_3d8 = local_420._8_8_;
          uStack_3d0 = local_430._0_8_;
          uStack_3c8 = local_430._8_8_;
          local_1700 = local_420._0_8_;
          uStack_16f8 = local_420._8_8_;
          uStack_16f0 = local_430._0_8_;
          uStack_16e8 = local_430._8_8_;
          local_15c0 = local_16e0;
          uStack_15b8 = uStack_16d8;
          uStack_15b0 = uStack_16d0;
          uStack_15a8 = uStack_16c8;
          local_15e0._0_4_ = local_420._0_4_;
          local_15e0._4_4_ = local_420._4_4_;
          uStack_15d8._0_4_ = local_420._8_4_;
          uStack_15d8._4_4_ = local_420._12_4_;
          uStack_15d0._0_4_ = local_430._0_4_;
          uStack_15d0._4_4_ = local_430._4_4_;
          uStack_15c8._0_4_ = local_430._8_4_;
          fVar70 = fVar70 * (float)local_15e0;
          fVar71 = fVar71 * local_15e0._4_4_;
          fVar72 = fVar72 * (float)uStack_15d8;
          fVar73 = fVar73 * uStack_15d8._4_4_;
          fVar74 = fVar74 * (float)uStack_15d0;
          fVar76 = fVar76 * uStack_15d0._4_4_;
          fVar77 = fVar77 * (float)uStack_15c8;
          local_16e0 = CONCAT44(fVar71,fVar70);
          uStack_16d8 = CONCAT44(fVar73,fVar72);
          uStack_16d0 = CONCAT44(fVar76,fVar74);
          uStack_16c8 = CONCAT44(fVar75,fVar77);
          local_1ec0 = local_16e0;
          uStack_1eb8 = uStack_16d8;
          uStack_1eb0 = uStack_16d0;
          uStack_1ea8 = uStack_16c8;
          local_1a60 = local_16e0;
          uStack_1a58 = uStack_16d8;
          uStack_1a50 = uStack_16d0;
          uStack_1a48 = uStack_16c8;
          local_1a40._0_4_ = (float)uVar10;
          local_1a40._4_4_ = (float)((ulong)uVar10 >> 0x20);
          uStack_1a38._0_4_ = (float)uVar11;
          uStack_1a38._4_4_ = (float)((ulong)uVar11 >> 0x20);
          uStack_1a30._0_4_ = (float)uVar12;
          uStack_1a30._4_4_ = (float)((ulong)uVar12 >> 0x20);
          uStack_1a28._0_4_ = (float)uVar13;
          uStack_1a28._4_4_ = (undefined4)((ulong)uVar13 >> 0x20);
          local_1ea0 = CONCAT44(local_1a40._4_4_ * fVar71,(float)local_1a40 * fVar70);
          uStack_1e98 = CONCAT44(uStack_1a38._4_4_ * fVar73,(float)uStack_1a38 * fVar72);
          uStack_1e90 = CONCAT44(uStack_1a30._4_4_ * fVar76,(float)uStack_1a30 * fVar74);
          uStack_1e88 = CONCAT44(uStack_1a28._4_4_,(float)uStack_1a28 * fVar77);
          local_1968 = local_1d68;
          auVar9._8_8_ = uStack_1e98;
          auVar9._0_8_ = local_1ea0;
          auVar9._16_8_ = uStack_1e90;
          auVar9._24_8_ = uStack_1e88;
          *local_1d68 = auVar9;
          local_1db8 = local_1db8 + 8;
          local_1d68 = local_1d68 + 1;
          local_1a40 = uVar10;
          uStack_1a38 = uVar11;
          uStack_1a30 = uVar12;
          uStack_1a28 = uVar13;
          local_1a20 = local_1780._0_8_;
          uStack_1a18 = local_1780._8_8_;
          uStack_1a10 = local_1780._16_8_;
          uStack_1a08 = local_1780._24_8_;
          local_1a00 = uVar14;
          uStack_19f8 = uVar15;
          uStack_19f0 = uVar16;
          uStack_19e8 = uVar17;
          local_19a0 = local_1ea0;
          uStack_1998 = uStack_1e98;
          uStack_1990 = uStack_1e90;
          uStack_1988 = uStack_1e88;
          local_18e0 = local_17c0._0_8_;
          uStack_18d8 = local_17c0._8_8_;
          uStack_18d0 = local_17c0._16_8_;
          uStack_18c8 = local_17c0._24_8_;
          local_1800 = local_1120;
          uStack_17f8 = uStack_1118;
          uStack_17f0 = uStack_1110;
          uStack_17e8 = uStack_1108;
          local_17e0 = local_1740._0_8_;
          uStack_17d8 = local_1740._8_8_;
          uStack_17d0 = local_1740._16_8_;
          uStack_17c8 = local_1740._24_8_;
          _local_1620 = auVar38;
          local_15e0 = local_420._0_8_;
          uStack_15d8 = local_420._8_8_;
          uStack_15d0 = local_430._0_8_;
          uStack_15c8 = local_430._8_8_;
          local_1400 = local_1420;
          uStack_13f8 = uStack_1418;
          uStack_13f0 = uStack_1410;
          uStack_13e8 = uStack_1408;
          local_1380 = local_1640;
          uStack_1378 = uStack_1638;
          uStack_1370 = uStack_1630;
          uStack_1368 = uStack_1628;
          local_1340 = uVar34;
          uStack_1338 = uVar35;
          uStack_1330 = uVar36;
          uStack_1328 = uVar37;
          local_1160 = local_12a0;
          uStack_1158 = uStack_1298;
          uStack_1150 = uStack_1290;
          uStack_1148 = uStack_1288;
          _local_10e0 = auVar40;
          _local_1020 = auVar41;
          local_f60 = local_10a0;
          uStack_f58 = uStack_1098;
          uStack_f50 = uStack_1090;
          uStack_f48 = uStack_1088;
          local_ca0 = local_cc0;
          uStack_c98 = uStack_cb8;
          uStack_c90 = uStack_cb0;
          uStack_c88 = uStack_ca8;
          local_c40 = uVar30;
          uStack_c38 = uVar31;
          uStack_c30 = uVar32;
          uStack_c28 = uVar33;
          local_9c0 = uVar26;
          uStack_9b8 = uVar27;
          uStack_9b0 = uVar28;
          uStack_9a8 = uVar29;
          local_9a0 = uVar22;
          uStack_998 = uVar23;
          uStack_990 = uVar24;
          uStack_988 = uVar25;
          local_960 = uVar18;
          uStack_958 = uVar19;
          uStack_950 = uVar20;
          uStack_948 = uVar21;
          local_8a0 = local_1820;
          uStack_898 = uStack_1818;
          uStack_890 = uStack_1810;
          uStack_888 = uStack_1808;
        }
        for (; local_1740 = auVar69, local_1780 = auVar68, local_17c0 = auVar67,
            local_1e04 < local_1ac4; local_1e04 = local_1e04 + 1) {
          fVar70 = *(float *)*local_1d68;
          dVar66 = std::pow((double)(ulong)(uint)(*(float *)((long)in_RDI +
                                                            *(long *)(*in_RDI + -0x18) + 0xe0) +
                                                 local_1c6c * *local_1db8),
                            (double)((ulong)*(uint *)((long)in_RDI +
                                                     *(long *)(*in_RDI + -0x18) + 0xdc) ^
                                    0x8000000080000000));
          *(float *)*local_1d68 = fVar70 * SUB84(dVar66,0);
          local_1db8 = local_1db8 + 1;
          local_1d68 = (undefined1 (*) [32])(*local_1d68 + 4);
          auVar67 = local_17c0;
          auVar68 = local_1780;
          auVar69 = local_1740;
        }
      }
      local_1b20 = 0;
    }
    ncnn::Mat::~Mat((Mat *)0x4b7d9a);
joined_r0x004b843b:
    if (local_1b20 != 0) goto LAB_004b8475;
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
    local_1ec4 = local_1aac;
    local_1ec8 = local_1ab0;
    ncnn::Mat::Mat(in_stack_ffffffffffffdbe8,
                   (Mat *)CONCAT44(in_stack_ffffffffffffdbe4,in_stack_ffffffffffffdbe0));
    local_1f14 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 2;
    if (local_1f14 < 1) {
LAB_004b7f4c:
      local_1f64 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_1f64 = local_1f64 * local_1f64;
      local_1f68 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) / (float)local_1f64;
      std::allocator<int>::allocator((allocator<int> *)0x4b7fb1);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffdc0c,in_stack_ffffffffffffdc08),
                 CONCAT44(in_stack_ffffffffffffdc04,in_stack_ffffffffffffdc00),
                 (allocator_type *)CONCAT44(in_stack_ffffffffffffdbfc,in_stack_ffffffffffffdbf8));
      std::allocator<int>::~allocator((allocator<int> *)0x4b7fd7);
      local_1f90 = std::vector<int,_std::allocator<int>_>::operator[](&local_1f80,0);
      local_1f94 = 0;
      local_1f98 = 0;
      local_1f9c = local_1aac - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      for (local_1fa0 = 0; local_1fa0 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_1fa0 = local_1fa0 + 1) {
        for (local_1fa4 = 0; local_1fa4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)
            ; local_1fa4 = local_1fa4 + 1) {
          local_1f90[local_1f94] = local_1f98;
          local_1f94 = local_1f94 + 1;
          local_1f98 = local_1f98 + 1;
        }
        local_1f98 = local_1f9c + local_1f98;
      }
      for (local_1fa8 = 0; local_1fa8 < local_1ab4; local_1fa8 = local_1fa8 + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffdc10,(int)in_stack_ffffffffffffdc0c);
        pfVar64 = ncnn::Mat::operator_cast_to_float_(&local_1ff8);
        ncnn::Mat::~Mat((Mat *)0x4b8180);
        local_1fb0 = pfVar64;
        ncnn::Mat::channel(in_stack_ffffffffffffdc10,(int)in_stack_ffffffffffffdc0c);
        for (local_2044 = 0; local_2044 < local_1ec8; local_2044 = local_2044 + 1) {
          for (local_2048 = 0; local_2048 < local_1ec4; local_2048 = local_2048 + 1) {
            in_stack_ffffffffffffdc10 = (Mat *)ncnn::Mat::row(&local_2040,local_2044);
            local_2054 = 0.0;
            for (local_2058 = 0; local_2058 < local_1f64; local_2058 = local_2058 + 1) {
              local_2054 = *(float *)((long)&in_stack_ffffffffffffdc10->data +
                                     (long)local_1f90[local_2058] * 4 + (long)local_2048 * 4) +
                           local_2054;
            }
            fVar70 = local_1fb0[local_2048];
            dVar66 = std::pow((double)(ulong)(uint)(*(float *)((long)in_RDI +
                                                              *(long *)(*in_RDI + -0x18) + 0xe0) +
                                                   local_1f68 * local_2054),
                              (double)((ulong)*(uint *)((long)in_RDI +
                                                       *(long *)(*in_RDI + -0x18) + 0xdc) ^
                                      0x8000000080000000));
            in_stack_ffffffffffffdc0c = SUB84(dVar66,0);
            local_1fb0[local_2048] = fVar70 * in_stack_ffffffffffffdc0c;
          }
          local_1fb0 = local_1fb0 + local_1ec4;
        }
        ncnn::Mat::~Mat((Mat *)0x4b83f7);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffdbfc,in_stack_ffffffffffffdbf8));
      local_1b20 = 0;
    }
    else {
      local_1f60.data = (void *)*local_1aa8;
      local_1f60.elemsize = local_1aa8[2];
      local_1f60._24_8_ = local_1aa8[3];
      local_1f60.allocator = (Allocator *)local_1aa8[4];
      local_1f60._40_8_ = local_1aa8[5];
      local_1f60._48_8_ = local_1aa8[6];
      local_1f60._56_8_ = local_1aa8[7];
      local_1f60.refcount = (int *)local_1aa8[2];
      this_00 = &local_1f60;
      copy_make_border((Mat *)CONCAT44(in_stack_ffffffffffffdc3c,in_stack_ffffffffffffdc38),
                       (Mat *)CONCAT17(in_stack_ffffffffffffdc37,in_stack_ffffffffffffdc30),
                       (int)((ulong)in_stack_ffffffffffffdc28 >> 0x20),
                       (int)in_stack_ffffffffffffdc28,
                       (int)((ulong)in_stack_ffffffffffffdc20 >> 0x20),
                       (int)in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc48,fVar70,
                       (Option *)CONCAT44(in_stack_ffffffffffffdc54,in_stack_ffffffffffffdc50));
      bVar63 = ncnn::Mat::empty(this_00);
      if (!bVar63) {
        local_1aac = local_1ee4;
        local_1ab0 = local_1ee0;
        goto LAB_004b7f4c;
      }
      local_1a8c = -100;
      local_1b20 = 1;
    }
    ncnn::Mat::~Mat((Mat *)0x4b8432);
    goto joined_r0x004b843b;
  }
  local_1a8c = 0;
  local_1b20 = 1;
LAB_004b8475:
  ncnn::Mat::~Mat((Mat *)0x4b8485);
  return local_1a8c;
}

Assistant:

int LRN_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}